

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void output_bb_border_live_info(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  bitmap_t *ppVVar1;
  uint32_t *puVar2;
  size_t *psVar3;
  undefined1 auVar4 [32];
  int iVar5;
  VARR_MIR_reg_t *pVVar6;
  VARR_int *pVVar7;
  bitmap_el_t *pbVar8;
  live_range_t plVar9;
  long *plVar10;
  lr_bb_t plVar11;
  ulong *puVar12;
  bitmap_t pVVar13;
  MIR_item_t pMVar14;
  VARR_bitmap_t *pVVar15;
  byte bVar16;
  double dVar17;
  gen_ctx **ppgVar18;
  MIR_insn_t tail_insn;
  DLIST_LINK_bb_t *pDVar19;
  uint uVar20;
  live_range_t_conflict *pplVar21;
  bb_t_conflict *__ptr;
  data_flow_ctx *pdVar22;
  VARR_bb_t *pVVar23;
  MIR_insn_t pMVar24;
  VARR_live_range_t *pVVar25;
  int *piVar26;
  spill_cache_el_t *__ptr_00;
  func_cfg_t extraout_RAX;
  func_cfg_t pfVar27;
  bb_t pbVar28;
  loop_node_t_conflict plVar29;
  spill_el_t *psVar30;
  MIR_item_t pMVar31;
  bb_insn_t pbVar32;
  bb_insn_t pbVar33;
  ra_ctx *prVar34;
  anon_union_8_2_0ec0d2a8_for_u *paVar35;
  out_edge_t peVar36;
  in_edge_t_conflict peVar37;
  ra_ctx *prVar38;
  MIR_insn_t_conflict insn;
  bb_t_conflict pbVar39;
  VARR_spill_el_t *pVVar40;
  VARR_spill_el_t *extraout_RAX_00;
  gen_ctx_t pgVar41;
  in_edge_t peVar42;
  gen_ctx *pgVar43;
  MIR_item_t_conflict pMVar44;
  undefined8 *puVar45;
  void *pvVar46;
  bb_insn_t_conflict pbVar47;
  gen_ctx *pgVar48;
  lr_ctx *plVar49;
  bb_t pbVar50;
  void *pvVar51;
  MIR_context_t pMVar52;
  MIR_insn_t pMVar53;
  DLIST_LINK_MIR_item_t *pDVar54;
  DLIST_LINK_in_edge_t *pDVar55;
  DLIST_in_edge_t *pDVar56;
  in_edge_t peVar57;
  in_edge_t *ppeVar58;
  FILE *__stream;
  char *pcVar59;
  MIR_op_t *pMVar60;
  bb_t *ppbVar61;
  int iVar62;
  ulong uVar63;
  VARR_spill_cache_el_t *pVVar64;
  void *pvVar65;
  lr_bb_t_conflict plVar66;
  bitmap_t pVVar67;
  gen_ctx_t pgVar68;
  undefined1 *puVar69;
  MIR_context_t pMVar70;
  gen_ctx_t bb_insn;
  uint uVar71;
  MIR_reg_t MVar72;
  ulong uVar73;
  long lVar74;
  MIR_reg_t reg;
  size_t sVar75;
  FILE *pFVar76;
  ra_ctx *__s1;
  ulong uVar77;
  char *pcVar78;
  ulong uVar79;
  live_range_t_conflict plVar80;
  bb_insn_t pbVar81;
  live_range_t_conflict plVar82;
  ra_ctx *__ptr_01;
  lr_bb_t_conflict plVar83;
  MIR_insn_t pMVar84;
  gen_ctx_t pgVar85;
  gen_ctx_t pgVar86;
  void **ppvVar87;
  long lVar88;
  char *bb_00;
  MIR_reg_t *pMVar89;
  size_t sVar90;
  edge_t_conflict peVar91;
  ulong uVar92;
  bool bVar93;
  double dVar94;
  undefined1 in_ZMM0 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 in_ZMM2 [64];
  int iStack_1cc;
  gen_ctx_t pgStack_1c8;
  uint uStack_1c0;
  undefined1 auStack_1bc [20];
  size_t sStack_1a8;
  bb_t_conflict pbStack_1a0;
  bb_t *ppbStack_198;
  gen_ctx_t pgStack_190;
  gen_ctx_t pgStack_188;
  DLIST_LINK_bb_t *pDStack_180;
  ulong uStack_178;
  gen_ctx_t pgStack_170;
  bb_t_conflict pbStack_168;
  void **ppvStack_160;
  in_edge_t peStack_158;
  edge_t_conflict peStack_150;
  bitmap_t pVStack_148;
  MIR_context_t pMStack_140;
  bb_t pbStack_138;
  ra_ctx *prStack_130;
  bitmap_t pVStack_128;
  bitmap_t pVStack_120;
  bitmap_t pVStack_118;
  gen_ctx_t pgStack_110;
  MIR_context_t pMStack_108;
  bb_t pbStack_100;
  gen_ctx_t pgStack_f8;
  ra_ctx *prStack_f0;
  ra_ctx *prStack_e8;
  MIR_context_t pMStack_e0;
  MIR_reg_t MStack_d4;
  bb_insn_t pbStack_d0;
  DLIST_LINK_in_edge_t *pDStack_c8;
  spill_el_t *psStack_c0;
  MIR_insn_t_conflict pMStack_b8;
  rewrite_data rStack_b0;
  bitmap_t pVStack_98;
  bitmap_t pVStack_90;
  bitmap_t pVStack_88;
  undefined1 auStack_80 [16];
  size_t sStack_70;
  VARR_lr_gap_t *pVStack_68;
  bitmap_t pVStack_60;
  bitmap_t pVStack_58;
  gen_ctx_t pgStack_48;
  
  if (gen_ctx->lr_ctx->scan_vars_num == 0) {
    pMVar89 = (MIR_reg_t *)0x0;
LAB_0015bc22:
    output_bitmap(gen_ctx,"  live_in:",bb->in,1,pMVar89);
    output_bitmap(gen_ctx,"  live_out:",bb->out,1,pMVar89);
    return;
  }
  pVVar6 = gen_ctx->lr_ctx->scan_var_to_var_map;
  if (pVVar6 != (VARR_MIR_reg_t *)0x0) {
    pMVar89 = pVVar6->varr;
    goto LAB_0015bc22;
  }
  pgVar85 = gen_ctx;
  output_bb_border_live_info_cold_1();
  plVar49 = pgVar85->lr_ctx;
  uVar71 = pgVar85->optimize_level;
  pMStack_108 = (MIR_context_t)(ulong)pgVar85->curr_cfg->max_var;
  plVar49->curr_point = 0;
  pVVar25 = plVar49->var_live_ranges;
  pgStack_48 = gen_ctx;
  if (pVVar25 == (VARR_live_range_t *)0x0) {
    pVStack_148 = (bitmap_t)0x15e50b;
    reg_alloc_cold_82();
LAB_0015e50b:
    pVStack_148 = (bitmap_t)0x15e52a;
    __assert_fail("(VARR_live_range_tlength (gen_ctx->lr_ctx->var_live_ranges)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1980,"void build_live_ranges(gen_ctx_t)");
  }
  if (pVVar25->els_num != 0) goto LAB_0015e50b;
  puVar69 = (undefined1 *)((long)&pMStack_108->gen_ctx + 1);
  pgStack_f8 = (gen_ctx_t)CONCAT44(pgStack_f8._4_4_,uVar71);
  do {
    pVVar25 = pgVar85->lr_ctx->var_live_ranges;
    pplVar21 = pVVar25->varr;
    if (pplVar21 == (live_range_t_conflict *)0x0) goto LAB_0015e2f3;
    sVar90 = pVVar25->els_num;
    uVar63 = sVar90 + 1;
    if (pVVar25->size < uVar63) {
      sVar90 = (uVar63 >> 1) + uVar63;
      pVStack_148 = (bitmap_t)0x15bcf2;
      pplVar21 = (live_range_t_conflict *)realloc(pplVar21,sVar90 * 8);
      pVVar25->varr = pplVar21;
      pVVar25->size = sVar90;
      sVar90 = pVVar25->els_num;
      uVar63 = sVar90 + 1;
    }
    puVar69 = puVar69 + -1;
    pVVar25->els_num = uVar63;
    pplVar21[sVar90] = (live_range_t_conflict)0x0;
  } while (puVar69 != (undefined1 *)0x0);
  uVar71 = pgVar85->optimize_level;
  if (uVar71 != 0) {
    pdVar22 = pgVar85->data_flow_ctx;
    pVVar23 = pdVar22->worklist;
    if ((pVVar23 == (VARR_bb_t *)0x0) || (pVVar23->varr == (bb_t_conflict *)0x0)) {
      pVStack_148 = (bitmap_t)0x15e4e4;
      reg_alloc_cold_5();
LAB_0015e4e4:
      pVStack_148 = (bitmap_t)0x15e506;
      __assert_fail("(DLIST_out_edge_t_length (&(e->src->out_edges))) == 1 && (DLIST_in_edge_t_length (&(e->src->in_edges))) == 1"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x20ce,"void transform_edge_to_bb_placement(gen_ctx_t)");
    }
    pVVar23->els_num = 0;
    pbVar39 = (pgVar85->curr_cfg->bbs).head;
    if (pbVar39 != (bb_t_conflict)0x0) {
      do {
        pVVar23 = pgVar85->data_flow_ctx->worklist;
        __ptr = pVVar23->varr;
        if (__ptr == (bb_t_conflict *)0x0) {
          pVStack_148 = (bitmap_t)0x15e382;
          reg_alloc_cold_1();
LAB_0015e382:
          pVStack_148 = (bitmap_t)0x15e387;
          reg_alloc_cold_26();
LAB_0015e387:
          pVStack_148 = (bitmap_t)0x15e38c;
          reg_alloc_cold_21();
LAB_0015e38c:
          pVStack_148 = (bitmap_t)0x15e391;
          reg_alloc_cold_20();
LAB_0015e391:
          pVStack_148 = (bitmap_t)0x15e3b0;
          __assert_fail("spill_els_addr[i].edge_p",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x209a,"void transform_edge_to_bb_placement(gen_ctx_t)");
        }
        sVar90 = pVVar23->els_num;
        uVar63 = sVar90 + 1;
        if (pVVar23->size < uVar63) {
          sVar90 = (uVar63 >> 1) + uVar63;
          pVStack_148 = (bitmap_t)0x15bd8f;
          __ptr = (bb_t_conflict *)realloc(__ptr,sVar90 * 8);
          pVVar23->varr = __ptr;
          pVVar23->size = sVar90;
          sVar90 = pVVar23->els_num;
          uVar63 = sVar90 + 1;
        }
        pVVar23->els_num = uVar63;
        __ptr[sVar90] = pbVar39;
        pbVar39 = (pbVar39->bb_link).next;
      } while (pbVar39 != (bb_t)0x0);
      uVar71 = pgVar85->optimize_level;
      pdVar22 = pgVar85->data_flow_ctx;
    }
    if (uVar71 < 2) {
      pVVar23 = pdVar22->worklist;
      if (pVVar23 == (VARR_bb_t *)0x0) {
        pVStack_148 = (bitmap_t)0x15e5da;
        reg_alloc_cold_4();
LAB_0015e5da:
        pVStack_148 = (bitmap_t)0x15e5df;
        reg_alloc_cold_33();
LAB_0015e5df:
        pVStack_148 = (bitmap_t)0x15e601;
        __assert_fail("(DLIST_bb_insn_t_tail (&(e2->src->bb_insns))) != ((void*)0) && MIR_any_branch_code_p ((DLIST_bb_insn_t_tail (&(e2->src->bb_insns)))->insn->code)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x3bd,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
      }
      pVStack_148 = (bitmap_t)0x15bde2;
      qsort(pVVar23->varr,pVVar23->els_num,8,post_cmp);
      pdVar22 = pgVar85->data_flow_ctx;
    }
    pVVar23 = pdVar22->worklist;
    if (pVVar23 != (VARR_bb_t *)0x0) {
      uVar63 = 0;
      do {
        if (pVVar23->els_num <= uVar63) goto LAB_0015becf;
        if (pVVar23->varr == (bb_t_conflict *)0x0) goto LAB_0015e34f;
        pbVar39 = pVVar23->varr[uVar63];
        pbVar81 = (pbVar39->bb_insns).head;
        if (pbVar81 != (bb_insn_t)0x0) {
          pVStack_148 = (bitmap_t)0x15be28;
          process_bb_ranges(pgVar85,pbVar39,pbVar81->insn,((pbVar39->bb_insns).tail)->insn);
          pVVar23 = pgVar85->data_flow_ctx->worklist;
        }
        uVar63 = uVar63 + 1;
      } while (pVVar23 != (VARR_bb_t *)0x0);
    }
    pVStack_148 = (bitmap_t)0x15be3f;
    reg_alloc_cold_3();
  }
  pMVar84 = (((pgVar85->curr_func_item->u).func)->insns).head;
  pMVar53 = pMVar84;
  while (tail_insn = pMVar84, tail_insn != (MIR_insn_t)0x0) {
    pMVar84 = (tail_insn->insn_link).next;
    if (pgVar85->optimize_level == 0) {
      uVar71 = *(int *)&pMVar53->field_0x18 - 0xa7;
      pMVar24 = pMVar53;
      if ((uVar71 < 0xe) && ((0x2007U >> (uVar71 & 0x1f) & 1) != 0)) {
        pMVar24 = (MIR_insn_t)pMVar53->data;
      }
      pbVar39 = (bb_t_conflict)pMVar24->data;
      if (pMVar84 != (MIR_insn_t)0x0) {
        uVar71 = *(int *)&pMVar84->field_0x18 - 0xa7;
        pMVar24 = pMVar84;
        if ((uVar71 < 0xe) && ((0x2007U >> (uVar71 & 0x1f) & 1) != 0)) {
          pMVar24 = (MIR_insn_t)pMVar84->data;
        }
        goto LAB_0015beb0;
      }
      goto LAB_0015beb5;
    }
    pbVar39 = *(bb_t_conflict *)((long)pMVar53->data + 0x30);
    if (pMVar84 == (MIR_insn_t)0x0) goto LAB_0015beb5;
    pMVar24 = (MIR_insn_t)((long)pMVar84->data + 0x30);
LAB_0015beb0:
    if (pbVar39 != (bb_t_conflict)pMVar24->data) {
LAB_0015beb5:
      pVStack_148 = (bitmap_t)0x15bebd;
      process_bb_ranges(pgVar85,pbVar39,pMVar53,tail_insn);
      pMVar53 = pMVar84;
    }
  }
LAB_0015becf:
  if ((pgVar85->debug_file != (FILE *)0x0) && (1 < pgVar85->debug_level)) {
    pVStack_148 = (bitmap_t)0x15bee5;
    print_all_live_ranges(pgVar85);
  }
  plVar49 = pgVar85->lr_ctx;
  pVVar67 = plVar49->points_with_born_vars;
  if ((pVVar67 == (bitmap_t)0x0) || (pVVar67->varr == (bitmap_el_t *)0x0)) {
LAB_0015e4b1:
    pVStack_148 = (bitmap_t)0x15e4b6;
    reg_alloc_cold_80();
  }
  else {
    pVVar67->els_num = 0;
    pVVar67 = plVar49->points_with_dead_vars;
    if ((pVVar67 != (bitmap_t)0x0) && (pVVar67->varr != (bitmap_el_t *)0x0)) {
      pVVar67->els_num = 0;
      pVVar25 = plVar49->var_live_ranges;
      if (pVVar25 != (VARR_live_range_t *)0x0) {
        uVar63 = 0;
        do {
          if (pVVar25->els_num <= uVar63) goto LAB_0015c009;
          if (pVVar25->varr == (live_range_t_conflict *)0x0) goto LAB_0015e2f8;
          plVar80 = pVVar25->varr[uVar63];
          if (plVar80 != (live_range_t_conflict)0x0) {
            do {
              uVar73 = (ulong)plVar80->start;
              if (plVar80->finish < plVar80->start) {
                pVStack_148 = (bitmap_t)0x15e2a2;
                __assert_fail("lr->start <= lr->finish",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x18db,"void shrink_live_ranges(gen_ctx_t)");
              }
              pVVar67 = pgVar85->lr_ctx->points_with_born_vars;
              pVStack_148 = (bitmap_t)0x15bf89;
              bitmap_expand(pVVar67,uVar73 + 1);
              if (pVVar67 == (bitmap_t)0x0) {
                pVStack_148 = (bitmap_t)0x15e2a7;
                reg_alloc_cold_76();
LAB_0015e2a7:
                pVStack_148 = (bitmap_t)0x15e2ac;
                reg_alloc_cold_75();
                goto LAB_0015e2ac;
              }
              pVVar67->varr[uVar73 >> 6] = pVVar67->varr[uVar73 >> 6] | 1L << (uVar73 & 0x3f);
              uVar73 = (ulong)plVar80->finish;
              pVVar67 = pgVar85->lr_ctx->points_with_dead_vars;
              pVStack_148 = (bitmap_t)0x15bfc2;
              bitmap_expand(pVVar67,uVar73 + 1);
              if (pVVar67 == (bitmap_t)0x0) goto LAB_0015e2a7;
              pVVar67->varr[uVar73 >> 6] = pVVar67->varr[uVar73 >> 6] | 1L << (uVar73 & 0x3f);
              plVar80 = plVar80->next;
            } while (plVar80 != (live_range_t)0x0);
            plVar49 = pgVar85->lr_ctx;
          }
          pVVar25 = plVar49->var_live_ranges;
          uVar63 = uVar63 + 1;
        } while (pVVar25 != (VARR_live_range_t *)0x0);
      }
      pVStack_148 = (bitmap_t)0x15c009;
      reg_alloc_cold_78();
LAB_0015c009:
      pVVar7 = plVar49->point_map;
      if ((pVVar7 != (VARR_int *)0x0) && (pVVar7->varr != (int *)0x0)) {
        pVVar7->els_num = 0;
        if (-1 < plVar49->curr_point) {
          iVar62 = -1;
          do {
            pVVar7 = plVar49->point_map;
            piVar26 = pVVar7->varr;
            if (piVar26 == (int *)0x0) {
LAB_0015e345:
              pVStack_148 = (bitmap_t)0x15e34a;
              reg_alloc_cold_6();
LAB_0015e34a:
              pVStack_148 = (bitmap_t)0x15e34f;
              reg_alloc_cold_22();
LAB_0015e34f:
              pVStack_148 = (bitmap_t)0x15e354;
              reg_alloc_cold_2();
LAB_0015e354:
              pVStack_148 = (bitmap_t)0x15e359;
              reg_alloc_cold_57();
LAB_0015e359:
              pVStack_148 = (bitmap_t)0x15e35e;
              reg_alloc_cold_18();
LAB_0015e35e:
              pVStack_148 = (bitmap_t)0x15e37d;
              __assert_fail("reg > ST1_HARD_REG",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x210e,"void split(gen_ctx_t)");
            }
            sVar90 = pVVar7->els_num;
            uVar63 = sVar90 + 1;
            if (pVVar7->size < uVar63) {
              sVar90 = (uVar63 >> 1) + uVar63;
              pVStack_148 = (bitmap_t)0x15c06a;
              piVar26 = (int *)realloc(piVar26,sVar90 * 4);
              pVVar7->varr = piVar26;
              pVVar7->size = sVar90;
              sVar90 = pVVar7->els_num;
              plVar49 = pgVar85->lr_ctx;
              uVar63 = sVar90 + 1;
            }
            pVVar7->els_num = uVar63;
            piVar26[sVar90] = 0;
            iVar62 = iVar62 + 1;
          } while (iVar62 < plVar49->curr_point);
        }
        pVStack_148 = (bitmap_t)0x15c0a2;
        bitmap_ior(plVar49->points_with_born_or_dead_vars,plVar49->points_with_born_vars,
                   plVar49->points_with_dead_vars);
        pMVar70 = pMStack_108;
        plVar49 = pgVar85->lr_ctx;
        pVVar67 = plVar49->points_with_born_or_dead_vars;
        if (pVVar67 == (bitmap_t)0x0) {
          pVStack_148 = (bitmap_t)0x15e52f;
          reg_alloc_cold_73();
        }
        else {
          uVar63 = pVVar67->els_num;
          if (uVar63 == 0) {
            lVar88 = -1;
          }
          else {
            pbVar8 = pVVar67->varr;
            lVar88 = -1;
            uVar79 = 0;
            uVar73 = 0;
            uVar71 = 1;
LAB_0015c0db:
            do {
              if ((pbVar8[uVar79] != 0) && (uVar77 = pbVar8[uVar79] >> (uVar73 & 0x3f), uVar77 != 0)
                 ) {
                uVar79 = uVar77 & 1;
                while (uVar79 == 0) {
                  uVar73 = uVar73 + 1;
                  uVar79 = uVar77 & 2;
                  uVar77 = uVar77 >> 1;
                }
                pVVar67 = plVar49->points_with_born_vars;
                if (pVVar67 == (bitmap_t)0x0) {
                  pVStack_148 = (bitmap_t)0x15e5b1;
                  reg_alloc_cold_10();
                }
                else {
                  if (uVar73 < pVVar67->els_num << 6) {
                    bVar93 = (pVVar67->varr[uVar73 >> 6] >> (uVar73 & 0x3f) & 1) != 0;
                  }
                  else {
                    bVar93 = false;
                  }
                  pVVar67 = plVar49->points_with_dead_vars;
                  if (pVVar67 != (bitmap_t)0x0) {
                    uVar20 = 0;
                    if (uVar73 < pVVar67->els_num << 6) {
                      uVar20 = (uint)(pVVar67->varr[uVar73 >> 6] >> (uVar73 & 0x3f)) & 1;
                    }
                    if (uVar20 == 0 && !bVar93) goto LAB_0015e58d;
                    pVVar7 = plVar49->point_map;
                    if ((bool)(uVar71 != 0 & bVar93)) {
                      if (((pVVar7 == (VARR_int *)0x0) ||
                          (piVar26 = pVVar7->varr, piVar26 == (int *)0x0)) ||
                         (pVVar7->els_num <= uVar73)) goto LAB_0015e55c;
                      lVar88 = lVar88 + 1;
                    }
                    else if (((pVVar7 == (VARR_int *)0x0) ||
                             (piVar26 = pVVar7->varr, piVar26 == (int *)0x0)) ||
                            (pVVar7->els_num <= uVar73)) goto LAB_0015e557;
                    piVar26[uVar73] = (int)lVar88;
                    uVar73 = uVar73 + 1;
                    uVar79 = uVar73 >> 6;
                    uVar71 = uVar20;
                    if (uVar63 <= uVar79) break;
                    goto LAB_0015c0db;
                  }
                }
                pVStack_148 = (bitmap_t)0x15e5b6;
                reg_alloc_cold_9();
LAB_0015e5b6:
                pVStack_148 = (bitmap_t)0x15e5d5;
                __assert_fail("i < last_insn->nops",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x3ff,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
              }
              uVar79 = uVar79 + 1;
              uVar73 = uVar79 * 0x40;
            } while (uVar63 != uVar79);
          }
          pVVar25 = plVar49->var_live_ranges;
          if (pVVar25 != (VARR_live_range_t *)0x0) {
            sVar90 = pVVar25->els_num;
            pgStack_110 = pgVar85;
            if (sVar90 == 0) {
              pgVar41 = (gen_ctx_t)0x0;
              pgVar86 = (gen_ctx_t)0x0;
LAB_0015c31c:
              bb_00 = (char *)(lVar88 + 1);
              if (((FILE *)pgVar85->debug_file != (FILE *)0x0) && (1 < pgVar85->debug_level)) {
                pVStack_148 = (bitmap_t)0x15df79;
                fprintf((FILE *)pgVar85->debug_file,
                        "Compressing live range points: from %d to %ld - %ld%%\n",
                        (ulong)(uint)plVar49->curr_point,bb_00);
                __stream = (FILE *)pgVar85->debug_file;
                if (pgVar41 == pgVar86) goto LAB_0015e241;
                goto LAB_0015e226;
              }
              plVar49->curr_point = (int)bb_00;
LAB_0015c35b:
              pVStack_148 = (bitmap_t)0x15c363;
              assign(pgVar85);
              if (((FILE *)pgVar85->debug_file != (FILE *)0x0) && (1 < pgVar85->debug_level)) {
                pVStack_148 = (bitmap_t)0x15c391;
                fwrite("+++++++++++++Disposition after assignment:",0x2a,1,
                       (FILE *)pgVar85->debug_file);
                if (0x21 < (uint)pMVar70) {
                  uVar63 = 0x22;
                  do {
                    if ((uVar63 & 7) == 0) {
                      pVStack_148 = (bitmap_t)0x15c3c8;
                      fputc(10,(FILE *)pgVar85->debug_file);
                    }
                    pVStack_148 = (bitmap_t)0x15c3d8;
                    fprintf((FILE *)pgVar85->debug_file," %3u=>",uVar63);
                    pVVar25 = pgVar85->lr_ctx->var_live_ranges;
                    if (pVVar25 == (VARR_live_range_t *)0x0) {
                      pVStack_148 = (bitmap_t)0x15e411;
                      reg_alloc_cold_16();
                      goto LAB_0015e411;
                    }
                    if (uVar63 < pVVar25->els_num) {
                      if (pVVar25->varr == (live_range_t_conflict *)0x0) goto LAB_0015e4ac;
                      if (pVVar25->varr[uVar63] == (live_range_t_conflict)0x0) goto LAB_0015c444;
                      pVVar6 = pgVar85->ra_ctx->reg_renumber;
                      if (((pVVar6 == (VARR_MIR_reg_t *)0x0) || (pVVar6->varr == (MIR_reg_t *)0x0))
                         || (pVVar6->els_num <= uVar63)) {
                        pVStack_148 = (bitmap_t)0x15e454;
                        reg_alloc_cold_14();
LAB_0015e454:
                        pVStack_148 = (bitmap_t)0x15e459;
                        reg_alloc_cold_19();
LAB_0015e459:
                        pVStack_148 = (bitmap_t)0x15e478;
                        __assert_fail("nel > ST1_HARD_REG",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x2019,"void rewrite(gen_ctx_t)");
                      }
                      pVStack_148 = (bitmap_t)0x15c442;
                      fprintf((FILE *)pgVar85->debug_file,"%-2u",(ulong)pVVar6->varr[uVar63]);
                    }
                    else {
LAB_0015c444:
                      pVStack_148 = (bitmap_t)0x15c45a;
                      fwrite("UA",2,1,(FILE *)pgVar85->debug_file);
                    }
                    uVar71 = (int)uVar63 + 1;
                    uVar63 = (ulong)uVar71;
                  } while (uVar71 <= (uint)pMVar70);
                }
                pVStack_148 = (bitmap_t)0x15c472;
                fputc(10,(FILE *)pgVar85->debug_file);
              }
              MVar72 = 5 - (pgVar85->target_ctx->keep_fp_p == '\0');
              pVStack_148 = (bitmap_t)0x15c496;
              prStack_f0 = (ra_ctx *)
                           _MIR_get_module_global_var_hard_regs
                                     (pgVar85->ctx,pgVar85->curr_func_item->module);
              if (pgVar85->optimize_level < 2) {
                pMVar84 = (((pgVar85->curr_func_item->u).func)->insns).head;
                if (pMVar84 == (MIR_insn_t)0x0) {
LAB_0015c7d8:
                  lVar88 = 0;
                  bb_00 = (char *)0x0;
                  pgVar41 = (gen_ctx_t)0x0;
                }
                else {
                  pgVar41 = (gen_ctx_t)0x0;
                  bb_00 = (char *)0x0;
                  lVar88 = 0;
                  do {
                    pMVar53 = (pMVar84->insn_link).next;
                    bb_00 = (char *)((long)((gen_ctx_t)bb_00)->call_used_hard_regs +
                                    ((ulong)((*(ulong *)&pMVar84->field_0x18 & 0xfffffffc) == 0) -
                                    0x68));
                    pVStack_148 = (bitmap_t)0x15c4e1;
                    uVar71 = rewrite_insn(pgStack_110,pMVar84,MVar72,(rewrite_data *)0x0);
                    lVar88 = lVar88 + (ulong)uVar71;
                    pgVar41 = (gen_ctx_t)((long)&pgVar41->ctx + 1);
                    pMVar84 = pMVar53;
                  } while (pMVar53 != (MIR_insn_t)0x0);
                }
              }
              else {
                prVar38 = pgVar85->ra_ctx;
                pbStack_100 = (bb_t)pgVar85->temp_bitmap;
                prStack_e8 = (ra_ctx *)pgVar85->temp_bitmap2;
                puVar2 = &prVar38->spill_cache_age;
                *puVar2 = *puVar2 + 1;
                pVVar64 = prVar38->spill_cache;
                if ((pVVar64 == (VARR_spill_cache_el_t *)0x0) ||
                   (pVVar64->varr == (spill_cache_el_t *)0x0)) goto LAB_0015e534;
                pVVar64->els_num = 0;
                do {
                  pfVar27 = pgVar85->curr_cfg;
                  uVar63 = pVVar64->els_num;
                  if (pfVar27->max_var < uVar63) goto LAB_0015c5aa;
                  __ptr_00 = pVVar64->varr;
                  if (__ptr_00 == (spill_cache_el_t *)0x0) goto LAB_0015e359;
                  uVar73 = uVar63 + 1;
                  if (pVVar64->size <= uVar63) {
                    sVar90 = (uVar73 >> 1) + uVar73;
                    pVStack_148 = (bitmap_t)0x15c578;
                    __ptr_00 = (spill_cache_el_t *)realloc(__ptr_00,sVar90 * 8);
                    pVVar64->varr = __ptr_00;
                    pVVar64->size = sVar90;
                    uVar63 = pVVar64->els_num;
                    uVar73 = uVar63 + 1;
                  }
                  pVVar64->els_num = uVar73;
                  __ptr_00[uVar63].age = 0;
                  __ptr_00[uVar63].slot = 0;
                  pVVar64 = pgVar85->ra_ctx->spill_cache;
                } while (pVVar64 != (VARR_spill_cache_el_t *)0x0);
                pVStack_148 = (bitmap_t)0x15c5aa;
                reg_alloc_cold_17();
                pfVar27 = extraout_RAX;
LAB_0015c5aa:
                pMVar70 = (MIR_context_t)(pfVar27->bbs).head;
                if (pMVar70 == (MIR_context_t)0x0) goto LAB_0015c7d8;
                pgVar41 = (gen_ctx_t)0x0;
                bb_00 = (char *)0x0;
                lVar88 = 0;
                pbVar50 = pbStack_100;
                MStack_d4 = MVar72;
                do {
                  prVar38 = prStack_e8;
                  rStack_b0.regs_to_save = (bitmap_t)prStack_e8;
                  pVStack_148 = (bitmap_t)0x15c5f7;
                  pMStack_108 = pMVar70;
                  rStack_b0.bb = (bb_t_conflict)pMVar70;
                  rStack_b0.live = (bitmap_t)pbVar50;
                  bitmap_copy((bitmap_t)pbVar50,
                              (const_bitmap_t)(pMVar70->environment_module).module_link.prev);
                  MVar72 = MStack_d4;
                  if ((prVar38 == (ra_ctx *)0x0) ||
                     ((MIR_insn_t)prVar38->sorted_regs == (MIR_insn_t)0x0)) goto LAB_0015e34a;
                  *(void **)&prVar38->start_mem_loc = (void *)0x0;
                  pcVar59 = (pMStack_108->environment_module).name;
                  while (pcVar59 != (char *)0x0) {
                    pMVar84 = *(MIR_insn_t *)pcVar59;
                    pcVar59 = *(char **)(pcVar59 + 0x20);
                    bb_00 = (char *)((long)((gen_ctx_t)bb_00)->call_used_hard_regs +
                                    ((ulong)((*(ulong *)&pMVar84->field_0x18 & 0xfffffffc) == 0) -
                                    0x68));
                    pVStack_148 = (bitmap_t)0x15c653;
                    uVar71 = rewrite_insn(pgStack_110,pMVar84,MVar72,&rStack_b0);
                    lVar88 = lVar88 + (ulong)uVar71;
                    pgVar41 = (gen_ctx_t)((long)&pgVar41->ctx + 1);
                  }
                  if (pbStack_100 == (bb_t)0x0) goto LAB_0015e387;
                  pbVar50 = (bb_t)(pMStack_108->environment_module).items.tail;
                  if (pbVar50 == (bb_t)0x0) goto LAB_0015e38c;
                  pvVar46 = (void *)pbStack_100->index;
                  pvVar51 = (void *)pbVar50->index;
                  pbVar28 = pbStack_100;
                  pvVar65 = pvVar46;
                  if (pvVar51 < pvVar46) {
                    pbVar28 = pbVar50;
                    pbVar50 = pbStack_100;
                    pvVar65 = pvVar51;
                    pvVar51 = pvVar46;
                  }
                  pMVar31 = ((DLIST_LINK_MIR_item_t *)&pbVar50->rpost)->prev;
                  pVStack_148 = (bitmap_t)0x15c6b7;
                  iVar62 = bcmp(((DLIST_LINK_MIR_item_t *)&pbVar28->rpost)->prev,pMVar31,
                                (long)pvVar65 * 8);
                  MVar72 = MStack_d4;
                  pbVar50 = pbStack_100;
                  if (iVar62 != 0) goto LAB_0015e2bb;
                  if (pvVar65 < pvVar51) {
                    do {
                      if ((&pMVar31->data)[(long)pvVar65] != (void *)0x0) goto LAB_0015e2bb;
                      pvVar65 = (void *)((long)pvVar65 + 1);
                    } while (pvVar51 != pvVar65);
                  }
                  pvVar46 = *(void **)&prStack_e8->start_mem_loc;
                  if (pvVar46 != (void *)0x0) {
                    pvVar51 = (void *)0x0;
                    uVar63 = 0;
                    do {
                      while ((uVar73 = *(ulong *)((long)((MIR_insn_t)prStack_e8->sorted_regs)->ops +
                                                 (long)pvVar51 * 8 + -0x20), uVar73 == 0 ||
                             (uVar73 = uVar73 >> (uVar63 & 0x3f), uVar73 == 0))) {
                        pvVar51 = (void *)((long)pvVar51 + 1);
                        uVar63 = (long)pvVar51 * 0x40;
                        if (pvVar46 == pvVar51) goto LAB_0015c7c4;
                      }
                      uVar79 = uVar73 & 1;
                      while (uVar79 == 0) {
                        uVar63 = uVar63 + 1;
                        uVar79 = uVar73 & 2;
                        uVar73 = uVar73 >> 1;
                      }
                      if (uVar63 < 0x22) goto LAB_0015e459;
                      plVar10 = *(long **)&(pMStack_108->environment_module).last_temp_item_num;
                      if (plVar10 == (long *)0x0) goto LAB_0015e454;
                      reg = (MIR_reg_t)uVar63;
                      if (((ulong)(*plVar10 << 6) <= (uVar63 & 0xffffffff)) ||
                         ((*(ulong *)(plVar10[2] + (uVar63 >> 6 & 0x3ffffff) * 8) >> (uVar63 & 0x3f)
                          & 1) == 0)) goto LAB_0015e3bf;
                      uVar63 = uVar63 + 1;
                      pMVar84 = *(pMStack_108->environment_module).data;
                      pVStack_148 = (bitmap_t)0x15c7a6;
                      spill_restore_reg(pgStack_110,reg,MVar72,pMVar84,
                                        (uint)(*(int *)&pMVar84->field_0x18 == 0xb4),0);
                      pvVar51 = (void *)(uVar63 >> 6);
                      pvVar46 = *(void **)&prStack_e8->start_mem_loc;
                    } while (pvVar51 < pvVar46);
                  }
LAB_0015c7c4:
                  pMVar70 = (MIR_context_t)pMStack_108->unspec_protos;
                } while (pMVar70 != (MIR_context_t)0x0);
              }
              if (((FILE *)pgStack_110->debug_file != (FILE *)0x0) &&
                 (0 < *(int *)&((DLIST_LINK_bb_t *)&pgStack_110->debug_level)->prev)) {
                auVar96 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,lVar88);
                dVar17 = auVar96._0_8_ * 100.0;
                auVar96 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,bb_00);
                dVar94 = dVar17 / auVar96._0_8_;
                in_ZMM0 = ZEXT864((ulong)dVar94);
                auVar96 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,pgVar41);
                in_ZMM2 = ZEXT1664(auVar96);
                pVStack_148 = (bitmap_t)0x15c833;
                fprintf((FILE *)pgStack_110->debug_file,
                        "%5lu deleted RA noop moves out of %lu all moves (%.1f%%), out of %lu all insns (%.1f%%)\n"
                        ,dVar94,dVar17 / auVar96._0_8_,lVar88,bb_00);
              }
              pgVar85 = pgStack_110;
              if (prStack_f0 != (ra_ctx *)0x0) {
                pVStack_148 = (bitmap_t)0x15c851;
                bitmap_and_compl(pgStack_110->func_used_hard_regs,pgStack_110->func_used_hard_regs,
                                 (bitmap_t)prStack_f0);
              }
              if (1 < (uint)pgStack_f8) {
                if (((FILE *)pgVar85->debug_file != (FILE *)0x0) && (1 < pgVar85->debug_level)) {
                  pVStack_148 = (bitmap_t)0x15c91e;
                  fwrite("+++++++++++++Spill info:\n",0x19,1,(FILE *)pgVar85->debug_file);
                  pVStack_148 = (bitmap_t)0x15c939;
                  print_CFG(pgVar85,1,0,0,0,output_bb_spill_info);
                }
                MStack_d4 = 5 - (pgVar85->target_ctx->keep_fp_p == '\0');
                pVVar40 = pgVar85->ra_ctx->spill_els;
                if ((pVVar40 != (VARR_spill_el_t *)0x0) &&
                   (psVar30 = pVVar40->varr, psVar30 != (spill_el_t *)0x0)) {
                  pVVar40->els_num = 0;
                  pbVar39 = (pgVar85->curr_cfg->bbs).head;
                  if (pbVar39 != (bb_t_conflict)0x0) {
                    iVar62 = -1;
                    do {
                      pbVar39 = (pbVar39->bb_link).next;
                      if (pbVar39 == (bb_t)0x0) break;
                      bVar93 = iVar62 != 0;
                      iVar62 = iVar62 + 1;
                    } while (bVar93);
                    if (pbVar39 != (bb_t)0x0) {
LAB_0015c9af:
                      if ((pbVar39->bb_insns).head != (bb_insn_t)0x0) {
                        if (((FILE *)pgVar85->debug_file != (FILE *)0x0) &&
                           (1 < *(int *)&((DLIST_LINK_bb_t *)&pgVar85->debug_level)->prev)) {
                          plVar29 = pbVar39->loop_node;
                          iVar62 = -2;
                          do {
                            plVar29 = plVar29->parent;
                            iVar62 = iVar62 + 1;
                          } while (plVar29 != (loop_node_t)0x0);
                          if (iVar62 < 0) goto LAB_0015e4c0;
                          pVStack_148 = (bitmap_t)0x15c9fb;
                          fprintf((FILE *)pgVar85->debug_file,
                                  " Process BB%lu(level %d) for splitting\n",(void *)pbVar39->index)
                          ;
                        }
                        peVar91 = (edge_t_conflict)
                                  ((anon_union_8_10_166bea1d_for_u *)&pbVar39->out_edges)[1].func;
                        pMStack_108 = (MIR_context_t)
                                      ((ulong)pMStack_108 & 0xff0000ffffffffff | 0x1010000000000);
LAB_0015ca23:
                        if (peVar91 != (edge_t_conflict)0x0) {
                          pVStack_148 = (bitmap_t)0x15ca41;
                          bitmap_and_compl((bitmap_t)
                                           ((DLIST_bb_insn_t *)&pgVar85->temp_bitmap)->head,
                                           peVar91->dst->gen,pbVar39->gen);
                          pgVar41 = (gen_ctx_t)((DLIST_bb_insn_t *)&pgVar85->temp_bitmap)->head;
                          if (pgVar41 != (gen_ctx_t)0x0) {
                            pMVar70 = pgVar41->ctx;
                            if (pMVar70 != (MIR_context_t)0x0) {
                              pMVar52 = (MIR_context_t)0x0;
                              do {
                                if ((&pgVar41->curr_func_item->data)[(long)pMVar52] != (void *)0x0)
                                {
                                  pMVar52 = (MIR_context_t)0x0;
                                  uVar63 = 0;
                                  goto LAB_0015ca77;
                                }
                                pMVar52 = (MIR_context_t)((long)&pMVar52->gen_ctx + 1);
                              } while (pMVar70 != pMVar52);
                            }
                            goto LAB_0015ca6d;
                          }
                          pVStack_148 = (bitmap_t)0x15e2df;
                          reg_alloc_cold_25();
                          goto LAB_0015e2df;
                        }
                        pMVar44 = (MIR_item_t_conflict)(pbVar39->in_edges).tail;
                        pbStack_100 = pbVar39;
LAB_0015cb71:
                        if (pMVar44 == (MIR_item_t_conflict)0x0) goto LAB_0015cdd3;
                        pbVar81 = ((DLIST_bb_insn_t *)&pgVar85->temp_bitmap)->head;
                        if ((pbVar81 == (bb_insn_t)0x0) || (*(long *)&pbVar81->mem_index == 0))
                        goto LAB_0015e2b6;
                        pbVar81->insn = (MIR_insn_t)0x0;
                        puVar12 = *(ulong **)((long)pMVar44->data + 0x78);
                        if (puVar12 == (ulong *)0x0) {
LAB_0015e2df:
                          pVStack_148 = (bitmap_t)0x15e2e4;
                          reg_alloc_cold_31();
                        }
                        else {
                          uVar63 = *puVar12;
                          if (uVar63 != 0) {
                            uVar79 = 0;
                            uVar73 = 0;
                            do {
                              while ((uVar77 = *(ulong *)(puVar12[2] + uVar79 * 8), uVar77 == 0 ||
                                     (uVar77 = uVar77 >> (uVar73 & 0x3f), uVar77 == 0))) {
                                uVar79 = uVar79 + 1;
                                uVar73 = uVar79 * 0x40;
                                if (uVar63 == uVar79) goto LAB_0015ccae;
                              }
                              uVar79 = uVar77 & 1;
                              uVar92 = uVar73;
                              while (uVar79 == 0) {
                                uVar92 = uVar92 + 1;
                                uVar79 = uVar77 & 2;
                                uVar77 = uVar77 >> 1;
                              }
                              pVVar67 = pbStack_100->gen;
                              if (pVVar67 == (bitmap_t)0x0) goto LAB_0015e2e9;
                              uVar73 = uVar92 + 1;
                              if ((pVVar67->els_num << 6 <= uVar92) ||
                                 ((pVVar67->varr[uVar92 >> 6] >> (uVar92 & 0x3f) & 1) == 0)) {
                                pVVar67 = pbStack_100->in;
                                if (pVVar67 == (bitmap_t)0x0) goto LAB_0015e2ee;
                                if ((uVar92 < pVVar67->els_num << 6) &&
                                   (bb_00 = (char *)(uVar92 >> 6),
                                   (pVVar67->varr[(long)bb_00] >> (uVar92 & 0x3f) & 1) != 0)) {
                                  pgVar41 = (gen_ctx_t)
                                            ((DLIST_bb_insn_t *)&pgStack_110->temp_bitmap)->head;
                                  pVStack_148 = (bitmap_t)0x15cc7f;
                                  bitmap_expand((bitmap_t)pgVar41,uVar73);
                                  if (pgVar41 == (gen_ctx_t)0x0) goto LAB_0015e382;
                                  ppvVar87 = &pgVar41->curr_func_item->data + (long)bb_00;
                                  *ppvVar87 = (void *)((ulong)*ppvVar87 | 1L << (uVar92 & 0x3f));
                                  uVar63 = *puVar12;
                                }
                              }
                              uVar79 = uVar73 >> 6;
                            } while (uVar79 < uVar63);
                          }
LAB_0015ccae:
                          pgVar85 = pgStack_110;
                          pbVar81 = ((DLIST_bb_insn_t *)&pgStack_110->temp_bitmap)->head;
                          if (pbVar81 != (bb_insn_t)0x0) {
                            pMVar84 = pbVar81->insn;
                            if (pMVar84 != (MIR_insn_t)0x0) {
                              pMVar53 = (MIR_insn_t)0x0;
                              do {
                                if (*(long *)(*(long *)&pbVar81->mem_index + (long)pMVar53 * 8) != 0
                                   ) {
                                  pMVar53 = (MIR_insn_t)0x0;
                                  uVar63 = 0;
                                  goto LAB_0015ccea;
                                }
                                pMVar53 = (MIR_insn_t)((long)&pMVar53->data + 1);
                              } while (pMVar84 != pMVar53);
                            }
                            goto LAB_0015ccdd;
                          }
                        }
                        pVStack_148 = (bitmap_t)0x15e2e9;
                        reg_alloc_cold_30();
LAB_0015e2e9:
                        pVStack_148 = (bitmap_t)0x15e2ee;
                        reg_alloc_cold_28();
LAB_0015e2ee:
                        pVStack_148 = (bitmap_t)0x15e2f3;
                        reg_alloc_cold_27();
                        goto LAB_0015e2f3;
                      }
                      goto LAB_0015e3ed;
                    }
                    goto LAB_0015cdf3;
                  }
                  sVar90 = 0;
                  goto LAB_0015ce07;
                }
                goto LAB_0015e539;
              }
LAB_0015c85c:
              plVar49 = pgVar85->lr_ctx;
              pVVar25 = plVar49->var_live_ranges;
              if (pVVar25 == (VARR_live_range_t *)0x0) goto LAB_0015e53e;
              sVar90 = pVVar25->els_num;
              pplVar21 = pVVar25->varr;
              if (sVar90 == 0) goto LAB_0015c8d6;
              if (pplVar21 != (live_range_t_conflict *)0x0) {
                sVar75 = 0;
                do {
                  if (pplVar21[sVar75] != (live_range_t_conflict)0x0) {
                    plVar9 = pplVar21[sVar75];
                    plVar80 = plVar49->free_lr_list;
                    do {
                      plVar82 = plVar9;
                      plVar9 = plVar82->next;
                      if (plVar82->lr_bb != (lr_bb_t_conflict)0x0) {
                        plVar66 = plVar49->free_lr_bb_list;
                        plVar11 = plVar82->lr_bb;
                        do {
                          plVar83 = plVar11;
                          plVar11 = plVar83->next;
                          plVar83->next = plVar66;
                          plVar66 = plVar83;
                        } while (plVar11 != (lr_bb_t)0x0);
                        plVar49->free_lr_bb_list = plVar83;
                      }
                      plVar82->next = plVar80;
                      plVar80 = plVar82;
                    } while (plVar9 != (live_range_t)0x0);
                    plVar49->free_lr_list = plVar82;
                  }
                  sVar75 = sVar75 + 1;
                } while (sVar75 != sVar90);
LAB_0015c8d6:
                if (pplVar21 != (live_range_t_conflict *)0x0) {
                  pVVar25->els_num = 0;
                  return;
                }
                goto LAB_0015e543;
              }
              goto LAB_0015e552;
            }
            pplVar21 = pVVar25->varr;
            if (pplVar21 != (live_range_t_conflict *)0x0) {
              pgVar86 = (gen_ctx_t)0x0;
              pgVar41 = (gen_ctx_t)0x0;
              sVar75 = 0;
              do {
                plVar80 = pplVar21[sVar75];
                if (plVar80 != (live_range_t_conflict)0x0) {
                  pVVar7 = plVar49->point_map;
                  if ((pVVar7 == (VARR_int *)0x0) || (piVar26 = pVVar7->varr, piVar26 == (int *)0x0)
                     ) {
LAB_0015e2ac:
                    pVStack_148 = (bitmap_t)0x15e2b1;
                    reg_alloc_cold_12();
LAB_0015e2b1:
                    pVStack_148 = (bitmap_t)0x15e2b6;
                    reg_alloc_cold_11();
LAB_0015e2b6:
                    pVStack_148 = (bitmap_t)0x15e2bb;
                    reg_alloc_cold_32();
LAB_0015e2bb:
                    pVStack_148 = (bitmap_t)0x15e2da;
                    __assert_fail("bitmap_equal_p (live, bb->in)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                  ,0x2017,"void rewrite(gen_ctx_t)");
                  }
                  uVar63 = pVVar7->els_num;
                  plVar82 = (live_range_t_conflict)0x0;
                  do {
                    if (uVar63 <= (ulong)(long)plVar80->start) goto LAB_0015e2ac;
                    iVar62 = piVar26[plVar80->start];
                    plVar9 = plVar80->next;
                    plVar80->start = iVar62;
                    if (uVar63 <= (ulong)(long)plVar80->finish) goto LAB_0015e2b1;
                    iVar5 = piVar26[plVar80->finish];
                    plVar80->finish = iVar5;
                    if ((plVar82 == (live_range_t_conflict)0x0) ||
                       ((plVar82->start != iVar5 && (plVar82->start != iVar5 + 1)))) {
LAB_0015c2a4:
                      pgVar41 = (gen_ctx_t)((long)&pgVar41->ctx + 1);
                      plVar82 = plVar80;
                    }
                    else {
                      plVar66 = plVar80->lr_bb;
                      if (plVar82->lr_bb == (lr_bb_t_conflict)0x0) {
                        if (plVar66 != (lr_bb_t_conflict)0x0) goto LAB_0015c2a4;
                        plVar82->start = iVar62;
                        plVar82->next = plVar9;
                      }
                      else {
                        if (plVar66 == (lr_bb_t_conflict)0x0) goto LAB_0015c2a4;
                        plVar82->start = iVar62;
                        plVar82->next = plVar9;
                        do {
                          plVar11 = plVar66->next;
                          plVar66->next = plVar82->lr_bb;
                          plVar82->lr_bb = plVar66;
                          plVar80->lr_bb = plVar11;
                          plVar66 = plVar11;
                        } while (plVar11 != (lr_bb_t)0x0);
                      }
                      plVar80->next = plVar49->free_lr_list;
                      plVar49->free_lr_list = plVar80;
                    }
                    pgVar86 = (gen_ctx_t)((long)&pgVar86->ctx + 1);
                    plVar80 = plVar9;
                  } while (plVar9 != (live_range_t)0x0);
                }
                sVar75 = sVar75 + 1;
              } while (sVar75 != sVar90);
              goto LAB_0015c31c;
            }
            goto LAB_0015e54d;
          }
        }
        pVStack_148 = (bitmap_t)0x15e534;
        reg_alloc_cold_72();
LAB_0015e534:
        pVStack_148 = (bitmap_t)0x15e539;
        reg_alloc_cold_23();
LAB_0015e539:
        pVStack_148 = (bitmap_t)0x15e53e;
        reg_alloc_cold_68();
LAB_0015e53e:
        pVStack_148 = (bitmap_t)0x15e543;
        reg_alloc_cold_71();
LAB_0015e543:
        pVStack_148 = (bitmap_t)0x15e548;
        reg_alloc_cold_70();
LAB_0015e548:
        pVStack_148 = (bitmap_t)0x15e54d;
        reg_alloc_cold_65();
LAB_0015e54d:
        pVStack_148 = (bitmap_t)0x15e552;
        reg_alloc_cold_13();
LAB_0015e552:
        pVStack_148 = (bitmap_t)0x15e557;
        reg_alloc_cold_69();
LAB_0015e557:
        pVStack_148 = (bitmap_t)0x15e55c;
        reg_alloc_cold_7();
LAB_0015e55c:
        pVStack_148 = (bitmap_t)0x15e561;
        reg_alloc_cold_8();
LAB_0015e561:
        pVStack_148 = (bitmap_t)0x15e583;
        __assert_fail("(DLIST_out_edge_t_length (&(e->dst->out_edges))) == 1 && (DLIST_in_edge_t_length (&(e->dst->in_edges))) == 1"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x20d2,"void transform_edge_to_bb_placement(gen_ctx_t)");
      }
      goto LAB_0015e4bb;
    }
  }
  pVStack_148 = (bitmap_t)0x15e4bb;
  reg_alloc_cold_79();
LAB_0015e4bb:
  pVStack_148 = (bitmap_t)0x15e4c0;
  reg_alloc_cold_74();
LAB_0015e4c0:
  pVStack_148 = (bitmap_t)0x15e4df;
  __assert_fail("level >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1748,"int bb_loop_level(bb_t)");
  while( true ) {
    sVar90 = pVVar40->els_num;
    uVar73 = sVar90 + 1;
    if (pVVar40->size < uVar73) {
      bb_00 = (char *)((uVar73 >> 1) + uVar73);
      pVStack_148 = (bitmap_t)0x15cb04;
      psVar30 = (spill_el_t *)realloc(psVar30,(long)bb_00 * 0x10);
      pVVar40->varr = psVar30;
      pVVar40->size = (size_t)bb_00;
      sVar90 = pVVar40->els_num;
      uVar73 = sVar90 + 1;
    }
    uVar79 = uVar63 & 0xffffffff;
    pVVar40->els_num = uVar73;
    uVar63 = uVar63 + 1;
    pMStack_108 = (MIR_context_t)((ulong)pMStack_108 & 0xffffff0000000000 | uVar79 | 0x100000000);
    *(MIR_context_t *)(psVar30 + sVar90) = pMStack_108;
    psVar30[sVar90].u.e = peVar91;
    pMVar52 = (MIR_context_t)(uVar63 >> 6);
    pMVar70 = pgVar41->ctx;
    pgVar85 = pgStack_110;
    if (pMVar70 <= pMVar52) break;
LAB_0015ca77:
    while ((pvVar46 = (&pgVar41->curr_func_item->data)[(long)pMVar52], pvVar46 == (void *)0x0 ||
           (uVar73 = (ulong)pvVar46 >> (uVar63 & 0x3f), uVar73 == 0))) {
      pMVar52 = (MIR_context_t)((long)&pMVar52->gen_ctx + 1);
      uVar63 = (long)pMVar52 * 0x40;
      if (pMVar70 == pMVar52) goto LAB_0015ca6d;
    }
    uVar79 = uVar73 & 1;
    while (uVar79 == 0) {
      uVar63 = uVar63 + 1;
      uVar79 = uVar73 & 2;
      uVar73 = uVar73 >> 1;
    }
    if (uVar63 < 0x22) goto LAB_0015e2fd;
    pVVar40 = pgVar85->ra_ctx->spill_els;
    psVar30 = pVVar40->varr;
    if (psVar30 == (spill_el_t *)0x0) {
      pVStack_148 = (bitmap_t)0x15e321;
      reg_alloc_cold_24();
      goto LAB_0015e321;
    }
  }
LAB_0015ca6d:
  peVar91 = (peVar91->out_link).prev;
  goto LAB_0015ca23;
LAB_0015cdd3:
  pbVar39 = (pbStack_100->bb_link).next;
  if (pbVar39 == (bb_t)0x0) goto code_r0x0015cde5;
  goto LAB_0015c9af;
  while( true ) {
    pMVar52 = pgVar41->ctx;
    pMVar70 = (MIR_context_t)((long)&pMVar52->gen_ctx + 1);
    if (*(MIR_context_t *)&pgVar41->optimize_level < pMVar70) {
      bb_00 = (char *)((long)&pMVar70->gen_ctx + ((ulong)pMVar70 >> 1));
      pVStack_148 = (bitmap_t)0x15cd78;
      pMVar31 = (MIR_item_t)realloc(pMVar31,(long)bb_00 * 0x10);
      pgVar41->curr_func_item = pMVar31;
      *(char **)&pgVar41->optimize_level = bb_00;
      pMVar52 = pgVar41->ctx;
      pMVar70 = (MIR_context_t)((long)&pMVar52->gen_ctx + 1);
    }
    uVar73 = uVar63 & 0xffffffff;
    pgVar41->ctx = pMVar70;
    uVar63 = uVar63 + 1;
    pMStack_108 = (MIR_context_t)((ulong)pMStack_108 & 0xffffff0000000000 | uVar73);
    (&pMVar31->data)[(long)pMVar52 * 2] = pMStack_108;
    (&pMVar31->module)[(long)pMVar52 * 2] = (MIR_module_t)pMVar44;
    pMVar53 = (MIR_insn_t)(uVar63 >> 6);
    pMVar84 = pbVar81->insn;
    if (pMVar84 <= pMVar53) break;
LAB_0015ccea:
    while ((uVar73 = *(ulong *)(*(long *)&pbVar81->mem_index + (long)pMVar53 * 8), uVar73 == 0 ||
           (uVar73 = uVar73 >> (uVar63 & 0x3f), uVar73 == 0))) {
      pMVar53 = (MIR_insn_t)((long)&pMVar53->data + 1);
      uVar63 = (long)pMVar53 * 0x40;
      if (pMVar84 == pMVar53) goto LAB_0015ccdd;
    }
    uVar79 = uVar73 & 1;
    while (uVar79 == 0) {
      uVar63 = uVar63 + 1;
      uVar79 = uVar73 & 2;
      uVar73 = uVar73 >> 1;
    }
    if (uVar63 < 0x22) {
LAB_0015e321:
      pVStack_148 = (bitmap_t)0x15e340;
      __assert_fail("nel > ST1_HARD_REG",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x205d,"void collect_spill_els(gen_ctx_t)");
    }
    pgVar41 = (gen_ctx_t)pgVar85->ra_ctx->spill_els;
    pMVar31 = pgVar41->curr_func_item;
    if (pMVar31 == (MIR_item_t)0x0) {
      pVStack_148 = (bitmap_t)0x15e345;
      reg_alloc_cold_29();
      goto LAB_0015e345;
    }
  }
LAB_0015ccdd:
  pMVar44 = ((DLIST_MIR_item_t *)&pMVar44->item_link)->head;
  goto LAB_0015cb71;
LAB_0015e79e:
  pgVar86 = (gen_ctx_t)pbVar39->out;
  pgVar85 = pgVar41;
  bitmap_copy((bitmap_t)pgVar41,(const_bitmap_t)pgVar86);
  bb_insn = (gen_ctx_t)(pbVar39->bb_insns).tail;
  pbStack_1a0 = pbVar39;
  while (bb_insn != (gen_ctx_t)0x0) {
    pgStack_188 = (gen_ctx_t)((DLIST_LINK_bb_t *)&bb_insn->debug_level)->prev;
    pgVar86 = bb_insn;
    pgVar85 = pgVar68;
    clear_bb_insn_dead_vars(pgVar68,(bb_insn_t_conflict)bb_insn);
    pgVar43 = (gen_ctx *)bb_insn->ctx;
    uVar63 = (ulong)pgVar43->debug_file >> 0x20;
    pgStack_1c8 = bb_insn;
    if (uVar63 != 0) {
      sVar90 = 0;
      do {
        pgVar85 = (gen_ctx_t)pgVar68->ctx;
        pgVar86 = pgVar43;
        MIR_insn_op_mode((MIR_context_t)pgVar85,(MIR_insn_t_conflict)pgVar43,sVar90,&iStack_1cc);
        if (iStack_1cc != 0) {
          if (*(char *)(pgVar43->call_used_hard_regs + sVar90 * 6 + -8) == '\x02') {
            pgVar85 = (gen_ctx_t)pgVar68->lr_ctx;
            pgVar86 = (gen_ctx_t)(ulong)*(uint *)(pgVar43->call_used_hard_regs + sVar90 * 6 + -7);
            uVar71 = var_to_scan_var(pgVar85,*(uint *)(pgVar43->call_used_hard_regs +
                                                      sVar90 * 6 + -7));
            if ((-1 < (int)uVar71) && ((ulong)uVar71 < (ulong)((long)pgVar41->ctx << 6))) {
              bVar16 = (byte)uVar71 & 0x3f;
              pgVar86 = (gen_ctx_t)(-2L << bVar16 | 0xfffffffffffffffeU >> 0x40 - bVar16);
              ppvVar87 = &pgVar41->curr_func_item->data + (uVar71 >> 6);
              *ppvVar87 = (void *)((ulong)*ppvVar87 & (ulong)pgVar86);
            }
          }
          else if (*(char *)(pgVar43->call_used_hard_regs + sVar90 * 6 + -8) != '\v') {
            __assert_fail("op_ref->mode == MIR_OP_VAR",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x4ff,
                          "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                         );
          }
        }
        sVar90 = sVar90 + 1;
      } while (sVar90 < uVar63);
    }
    pFVar76 = pgVar43->debug_file;
    if ((pgVar68->lr_ctx->scan_vars_num == 0) && (0xfffffffc < (int)pFVar76 - 0xaaU)) {
      pgVar86 = pgVar41;
      pgVar85 = pgVar41;
      bitmap_and_compl((bitmap_t)pgVar41,(bitmap_t)pgVar41,pgVar68->call_used_hard_regs[0x12]);
      pFVar76 = pgVar43->debug_file;
    }
    uVar63 = (ulong)pFVar76 >> 0x20;
    if (uVar63 != 0) {
      pDStack_180 = (DLIST_LINK_bb_t *)&pgVar43->debug_level;
      uVar79 = 0;
      uVar73 = 0;
      auStack_1bc._4_8_ = &pgStack_1c8->tied_regs;
      auStack_1bc._12_8_ = pgVar43;
      sVar90 = uVar73;
      uStack_178 = uVar63;
      pDVar19 = pDStack_180;
LAB_0015e8e7:
      do {
        sStack_1a8 = sVar90;
        pgVar85 = (gen_ctx_t)pgVar68->ctx;
        pgVar86 = pgVar43;
        MIR_insn_op_mode((MIR_context_t)pgVar85,(MIR_insn_t_conflict)pgVar43,sStack_1a8,&iStack_1cc)
        ;
        if ((iStack_1cc == 0) || (*(char *)&pDVar19[uVar73 * 3].next == '\v')) {
          if (uVar79 < 2) {
            if (*(char *)&pDVar19[uVar73 * 3].next == '\v') {
              do {
                uVar71 = *(uint *)((long)&pDVar19[uVar73 * 3 + 2].prev + (ulong)(uVar79 != 0) * 4);
                if (uVar71 != 0xffffffff) {
                  uVar79 = uVar79 + 1;
                  goto LAB_0015e964;
                }
                bVar93 = uVar79 == 0;
                uVar79 = 1;
                pgVar43 = (gen_ctx *)auStack_1bc._12_8_;
              } while (bVar93);
            }
            else if (uVar79 != 1) {
              uVar79 = 0;
              if (*(char *)&pDVar19[uVar73 * 3].next != '\x02') goto LAB_0015ea9d;
              uVar71 = *(uint *)&pDVar19[uVar73 * 3 + 1].prev;
              uVar79 = 1;
LAB_0015e964:
              pgVar85 = (gen_ctx_t)pgVar68->lr_ctx;
              pgVar86 = (gen_ctx_t)(ulong)uVar71;
              uVar20 = var_to_scan_var(pgVar85,uVar71);
              if (-1 < (int)uVar20) {
                pgVar85 = pgVar41;
                bitmap_expand((bitmap_t)pgVar41,(ulong)uVar20 + 1);
                uVar63 = uStack_178;
                pvVar46 = (&pgVar41->curr_func_item->data)[uVar20 >> 6];
                pgVar86 = (gen_ctx_t)((ulong)pvVar46 | 1L << ((ulong)uVar20 & 0x3f));
                (&pgVar41->curr_func_item->data)[uVar20 >> 6] = pgVar86;
                if (((ulong)pvVar46 >> ((ulong)uVar20 & 0x3f) & 1) == 0) {
                  for (peVar42 = *(in_edge_t *)auStack_1bc._4_8_; peVar42 != (in_edge_t)0x0;
                      peVar42 = (peVar42->in_link).prev) {
                    if (*(uint *)&peVar42->src == uVar71) goto LAB_0015ea7c;
                  }
                  pgVar43 = (gen_ctx *)pgStack_190->ctx;
                  if (pgVar43 == (gen_ctx *)0x0) {
                    pgVar86 = (gen_ctx_t)&DAT_00000018;
                    pgVar85 = pgVar68;
                    pgVar43 = (gen_ctx *)gen_malloc(pgVar68,0x18);
                  }
                  else {
                    pbVar50 = *(bb_t *)&pgVar43->optimize_level;
                    pgVar48 = (gen_ctx *)((DLIST_LINK_in_edge_t *)&pgVar43->curr_func_item)->prev;
                    pgVar85 = (gen_ctx_t)&pbVar50->rpost;
                    if (pbVar50 == (bb_t)0x0) {
                      pgVar85 = pgStack_190;
                    }
                    pgVar85->ctx = (MIR_context_t)pgVar48;
                    if (pgVar48 == (gen_ctx *)0x0) {
                      ppbVar61 = ppbStack_198;
                      if ((gen_ctx *)*ppbStack_198 != pgVar43) goto LAB_0015ebda;
                    }
                    else {
                      ppbVar61 = (bb_t *)&pgVar48->optimize_level;
                    }
                    pgVar86 = (gen_ctx_t)&pgVar43->optimize_level;
                    *ppbVar61 = pbVar50;
                    *(size_t *)pgVar86 = 0;
                    pgVar43->curr_func_item = (MIR_item_t)0x0;
                    pgVar85 = pgStack_190;
                  }
                  *(uint *)&pgVar43->ctx = uVar71;
                  pbVar50 = (bb_t)((DLIST_out_edge_t *)&pgStack_1c8->addr_regs)->head;
                  if (pbVar50 == (bb_t)0x0) {
                    pDVar55 = (DLIST_LINK_in_edge_t *)auStack_1bc._4_8_;
                    if (*(in_edge_t *)auStack_1bc._4_8_ != (in_edge_t)0x0) goto LAB_0015ebd5;
                  }
                  else {
                    if (((DLIST_LINK_in_edge_t *)&pbVar50->rpost)->prev != (in_edge_t)0x0) {
                      add_bb_insn_dead_vars_cold_2();
LAB_0015ebd5:
                      add_bb_insn_dead_vars_cold_3();
LAB_0015ebda:
                      add_bb_insn_dead_vars_cold_1();
LAB_0015ebdf:
                      __assert_fail("gen_ctx->optimize_level > 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x1802,"void add_bb_insn_dead_vars(gen_ctx_t)");
                    }
                    pDVar55 = (DLIST_LINK_in_edge_t *)&pbVar50->rpost;
                  }
                  pDVar55->prev = (in_edge_t)pgVar43;
                  ((DLIST_LINK_in_edge_t *)&pgVar43->curr_func_item)->prev = (in_edge_t)0x0;
                  *(bb_t *)&pgVar43->optimize_level = pbVar50;
                  ((DLIST_out_edge_t *)&pgStack_1c8->addr_regs)->head = (out_edge_t)pgVar43;
                }
              }
LAB_0015ea7c:
              pgVar43 = (gen_ctx *)auStack_1bc._12_8_;
              sVar90 = sStack_1a8;
              if (uVar63 <= sStack_1a8) break;
              goto LAB_0015e8e7;
            }
          }
          uVar79 = 0;
        }
LAB_0015ea9d:
        uVar73 = sStack_1a8 + 1;
        sVar90 = uVar73;
        pDVar19 = pDStack_180;
      } while (uVar73 < uVar63);
    }
    bb_insn = pgStack_188;
    if (pgVar68->lr_ctx->scan_vars_num == 0) {
      pgVar85 = (gen_ctx_t)pgVar43->debug_file;
      pgVar86 = (gen_ctx_t)auStack_1bc;
      target_get_early_clobbered_hard_regs((MIR_insn_t)pgVar85,(MIR_reg_t *)pgVar86,&uStack_1c0);
      if (((ulong)(uint)auStack_1bc._0_4_ != 0xffffffff) &&
         ((ulong)(uint)auStack_1bc._0_4_ < (ulong)((long)pgVar41->ctx << 6))) {
        bVar16 = (byte)auStack_1bc._0_4_ & 0x3f;
        pgVar86 = (gen_ctx_t)(-2L << bVar16 | 0xfffffffffffffffeU >> 0x40 - bVar16);
        ppvVar87 = &pgVar41->curr_func_item->data + ((uint)auStack_1bc._0_4_ >> 6);
        *ppvVar87 = (void *)((ulong)*ppvVar87 & (ulong)pgVar86);
      }
      if (((ulong)uStack_1c0 != 0xffffffff) &&
         ((ulong)uStack_1c0 < (ulong)((long)pgVar41->ctx << 6))) {
        bVar16 = (byte)uStack_1c0 & 0x3f;
        pgVar86 = (gen_ctx_t)(-2L << bVar16 | 0xfffffffffffffffeU >> 0x40 - bVar16);
        ppvVar87 = &pgVar41->curr_func_item->data + (uStack_1c0 >> 6);
        *ppvVar87 = (void *)((ulong)*ppvVar87 & (ulong)pgVar86);
      }
      bb_insn = pgStack_188;
      if (0xfffffffc < *(int *)&pgVar43->debug_file - 0xaaU) {
        pgVar86 = pgVar41;
        pgVar85 = pgVar41;
        bitmap_ior((bitmap_t)pgVar41,(bitmap_t)pgVar41,(bitmap_t)pgStack_1c8->insn_to_consider);
        bb_insn = pgStack_188;
      }
    }
  }
  pbVar39 = (pbStack_1a0->bb_link).next;
  if (pbVar39 == (bb_t)0x0) {
    pMVar31 = pgVar41->curr_func_item;
LAB_0015eb8c:
    if (pMVar31 != (MIR_item_t)0x0) {
      free(pMVar31);
      free(pgVar41);
      return;
    }
    add_bb_insn_dead_vars_cold_4();
    if (pgVar85->lr_ctx->scan_vars_num == 0) {
      pMVar89 = (MIR_reg_t *)0x0;
    }
    else {
      pVVar6 = pgVar85->lr_ctx->scan_var_to_var_map;
      if (pVVar6 == (VARR_MIR_reg_t *)0x0) {
        output_bb_live_info_cold_1();
        pgVar43 = (gen_ctx *)gen_malloc(pgVar85,0xa8);
        pgVar43->call_used_hard_regs[6] = (bitmap_t)0x0;
        pMVar44 = (MIR_item_t_conflict)malloc(0x18);
        pMVar44->data = (void *)0x0;
        pgVar43->debug_file = (FILE *)0x0;
        *(c2mir_ctx **)&pgVar43->optimize_level = (c2mir_ctx *)0x0;
        pgVar43->curr_func_item = (MIR_item_t)0x0;
        pMVar44->module = (MIR_module_t)0x4;
        *(undefined1 (*) [32])&pgVar43->addr_insn_p = ZEXT432(0) << 0x40;
        *(undefined1 (*) [32])((long)&pgVar43->addr_regs + 3) = ZEXT432(0) << 0x40;
        pMVar31 = (MIR_item_t)malloc(0x20);
        (pMVar44->item_link).prev = pMVar31;
        pgVar43->call_used_hard_regs[0] = (bitmap_t)pMVar44;
        puVar45 = (undefined8 *)malloc(0x18);
        *puVar45 = 0;
        puVar45[1] = 4;
        pvVar46 = malloc(0x20);
        puVar45[2] = pvVar46;
        pgVar43->call_used_hard_regs[1] = (bitmap_t)puVar45;
        puVar45 = (undefined8 *)malloc(0x18);
        *puVar45 = 0;
        puVar45[1] = 4;
        pvVar46 = malloc(0x20);
        puVar45[2] = pvVar46;
        pgVar43->call_used_hard_regs[2] = (bitmap_t)puVar45;
        puVar45 = (undefined8 *)malloc(0x18);
        *puVar45 = 0;
        puVar45[1] = 4;
        pvVar46 = malloc(0x20);
        puVar45[2] = pvVar46;
        pgVar43->call_used_hard_regs[3] = (bitmap_t)puVar45;
        puVar45 = (undefined8 *)malloc(0x18);
        *puVar45 = 0;
        puVar45[1] = 4;
        pvVar46 = malloc(0x20);
        puVar45[2] = pvVar46;
        pgVar43->call_used_hard_regs[4] = (bitmap_t)puVar45;
        puVar45 = (undefined8 *)malloc(0x18);
        *puVar45 = 0;
        puVar45[1] = 4;
        pvVar46 = malloc(0x20);
        pgVar43->call_used_hard_regs[5] = (bitmap_t)puVar45;
        puVar45[2] = pvVar46;
        pgVar43->call_used_hard_regs[7] = (bitmap_t)0x0;
        if (pgVar86 != (gen_ctx_t)0x0) {
          if (pgVar85->optimize_level == 0) {
            uVar71 = *(int *)&pgVar86->debug_file - 0xa7;
            if ((uVar71 < 0xe) && ((0x2007U >> (uVar71 & 0x1f) & 1) != 0)) {
              pgVar48 = (gen_ctx *)gen_malloc(pgVar85,0x10);
              pgVar86->ctx = (MIR_context_t)pgVar48;
              pgVar48->ctx = (MIR_context_t)pgVar43;
              *(undefined8 *)&pgVar48->optimize_level = 0;
            }
            else {
              pgVar86->ctx = (MIR_context_t)pgVar43;
            }
          }
          else {
            pbVar47 = create_bb_insn(pgVar85,(MIR_insn_t)pgVar86,(bb_t_conflict)pgVar43);
            DLIST_bb_insn_t_append((DLIST_bb_insn_t *)&pgVar43->temp_bitmap,pbVar47);
          }
        }
        return;
      }
      pMVar89 = pVVar6->varr;
    }
    output_bb_border_live_info(pgVar85,(bb_t_conflict)pgVar86);
    output_bitmap(pgVar85,"  live_gen:",pgVar86->call_used_hard_regs[2],1,pMVar89);
    output_bitmap(pgVar85,"  live_kill:",pgVar86->call_used_hard_regs[3],1,pMVar89);
    return;
  }
  goto LAB_0015e79e;
LAB_0015e2f3:
  pVStack_148 = (bitmap_t)0x15e2f8;
  reg_alloc_cold_81();
LAB_0015e2f8:
  pVStack_148 = (bitmap_t)0x15e2fd;
  reg_alloc_cold_77();
LAB_0015e2fd:
  pVStack_148 = (bitmap_t)0x15e31c;
  __assert_fail("nel > ST1_HARD_REG",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x204d,"void collect_spill_els(gen_ctx_t)");
code_r0x0015cde5:
  pVVar40 = pgVar85->ra_ctx->spill_els;
LAB_0015cdf3:
  if (pVVar40 == (VARR_spill_el_t *)0x0) goto LAB_0015e5da;
  sVar90 = pVVar40->els_num;
  psVar30 = pVVar40->varr;
LAB_0015ce07:
  pVStack_148 = (bitmap_t)0x15ce20;
  psStack_c0 = psVar30;
  qsort(psVar30,sVar90,0x10,spill_el_sort_cmp);
  pgVar86 = pgVar41;
  if (((FILE *)pgVar85->debug_file != (FILE *)0x0) &&
     (1 < *(int *)&((DLIST_LINK_bb_t *)&pgStack_110->debug_level)->prev)) {
    pVStack_148 = (bitmap_t)0x15ce52;
    fwrite(" Spills on edges:\n",0x12,1,(FILE *)pgVar85->debug_file);
    pgVar86 = pgStack_110;
    pVVar40 = pgStack_110->ra_ctx->spill_els;
    if (pVVar40 != (VARR_spill_el_t *)0x0) {
      uVar63 = 0xffffffffffffffff;
      paVar35 = &psStack_c0->u;
      do {
        uVar63 = uVar63 + 1;
        if (pVVar40->els_num <= uVar63) goto LAB_0015cf14;
        if (*(char *)((long)paVar35 + -3) == '\0') {
LAB_0015e411:
          pVStack_148 = (bitmap_t)0x15e430;
          __assert_fail("spill_els_addr[i].edge_p",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x20f1,"void split(gen_ctx_t)");
        }
        pcVar59 = "spill";
        bb_00 = (char *)(paVar35 + 2);
        if (*(char *)((long)paVar35 + -4) == '\0') {
          pcVar59 = "restore";
        }
        pMStack_140 = (MIR_context_t)paVar35->e->dst->index;
        pVStack_148 = (bitmap_t)0x15cef8;
        fprintf((FILE *)pgVar86->debug_file,"  %s r%d on %s of edge bb%lu->bb%lu\n",pcVar59,
                (ulong)((spill_el_t *)(paVar35 + -1))->reg);
        pVVar40 = pgVar86->ra_ctx->spill_els;
        paVar35 = (anon_union_8_2_0ec0d2a8_for_u *)bb_00;
        pgVar41 = pgVar86;
      } while (pVVar40 != (VARR_spill_el_t *)0x0);
    }
    pgVar86 = pgVar41;
    pVStack_148 = (bitmap_t)0x15cf14;
    reg_alloc_cold_34();
  }
LAB_0015cf14:
  auVar95 = in_ZMM2._0_16_;
  auVar96 = in_ZMM0._0_16_;
  pVVar40 = pgStack_110->ra_ctx->spill_els;
  if (pVVar40 == (VARR_spill_el_t *)0x0) {
    pVStack_148 = (bitmap_t)0x15e588;
    reg_alloc_cold_67();
    goto LAB_0015e588;
  }
  if (pVVar40->els_num == 0) {
    sVar90 = 0;
  }
  else {
    bb_00 = (char *)pVVar40->varr;
    pbVar81 = ((DLIST_bb_insn_t *)&pgStack_110->temp_bitmap)->head;
    pbVar39 = (pgStack_110->curr_cfg->bbs).head;
    pbStack_100 = (bb_t)bb_00;
    if (pbVar39 != (bb_t_conflict)0x0) {
      iVar62 = -1;
      do {
        pbVar39 = (pbVar39->bb_link).next;
        if (pbVar39 == (bb_t)0x0) break;
        bVar93 = iVar62 != 0;
        iVar62 = iVar62 + 1;
      } while (bVar93);
      do {
        if (pbVar39 == (bb_t)0x0) break;
        pVVar67 = pbVar39->kill;
        if ((pVVar67 == (bitmap_t)0x0) || (pVVar67->varr == (bitmap_el_t *)0x0)) {
LAB_0015e3e3:
          pVStack_148 = (bitmap_t)0x15e3e8;
          reg_alloc_cold_36();
          goto LAB_0015e3e8;
        }
        pVVar67->els_num = 0;
        pVVar67 = pbVar39->gen;
        if ((pVVar67 == (bitmap_t)0x0) || (pVVar67->varr == (bitmap_el_t *)0x0)) {
          pVStack_148 = (bitmap_t)0x15e3e3;
          reg_alloc_cold_35();
          goto LAB_0015e3e3;
        }
        pVVar67->els_num = 0;
        for (peVar36 = (pbVar39->out_edges).head; peVar36 != (out_edge_t)0x0;
            peVar36 = (peVar36->out_link).next) {
          peVar36->flag1 = '\0';
          peVar36->flag2 = '\0';
        }
        pbVar39 = (pbVar39->bb_link).next;
      } while( true );
    }
    pgVar85 = (gen_ctx_t)0x0;
    do {
      if (*(char *)((long)&((bb_t)bb_00)->index + 5) == '\0') goto LAB_0015e391;
      peVar91 = ((anon_union_8_2_0ec0d2a8_for_u *)&((bb_t)bb_00)->pre)->e;
      bVar93 = true;
      if ((*(char *)((long)&((bb_t)bb_00)->index + 4) == '\0') &&
         (((iVar62 = (int)*(undefined8 *)&((peVar91->src->bb_insns).tail)->insn->field_0x18,
           0xffffffd0 < iVar62 - 0xa5U || (iVar62 == 0xaa)) || (iVar62 == 0xa6)))) {
        bVar93 = iVar62 == 0x76;
      }
      peVar91->flag1 = bVar93;
      peVar91->flag2 = '\x01';
      uVar71 = *(uint *)&((bb_t)bb_00)->index;
      pVVar67 = peVar91->src->kill;
      pVStack_148 = (bitmap_t)0x15d042;
      bitmap_expand(pVVar67,(ulong)uVar71 + 1);
      if (pVVar67 == (bitmap_t)0x0) {
        pVStack_148 = (bitmap_t)0x15e3b5;
        reg_alloc_cold_62();
LAB_0015e3b5:
        pVStack_148 = (bitmap_t)0x15e3ba;
        reg_alloc_cold_61();
LAB_0015e3ba:
        pVStack_148 = (bitmap_t)0x15e3bf;
        reg_alloc_cold_60();
LAB_0015e3bf:
        pVStack_148 = (bitmap_t)0x15e3de;
        __assert_fail("bitmap_bit_p (bb->kill, reg)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x201b,"void rewrite(gen_ctx_t)");
      }
      pVVar67->varr[uVar71 >> 6] = pVVar67->varr[uVar71 >> 6] | 1L << ((ulong)uVar71 & 0x3f);
      uVar71 = *(uint *)&((bb_t)bb_00)->index;
      pVVar67 = peVar91->dst->gen;
      pVStack_148 = (bitmap_t)0x15d080;
      bitmap_expand(pVVar67,(ulong)uVar71 + 1);
      auVar95 = in_ZMM2._0_16_;
      auVar96 = in_ZMM0._0_16_;
      if (pVVar67 == (bitmap_t)0x0) goto LAB_0015e3b5;
      pVVar67->varr[uVar71 >> 6] = pVVar67->varr[uVar71 >> 6] | 1L << ((ulong)uVar71 & 0x3f);
      prVar38 = pgStack_110->ra_ctx;
      pgVar41 = (gen_ctx_t)prVar38->lr_gap_bitmaps[0x23];
      if (pgVar41 == (gen_ctx_t)0x0) goto LAB_0015e3ba;
      pgVar86 = (gen_ctx_t)pgVar41->ctx;
      pgVar85 = (gen_ctx_t)((long)&pgVar85->ctx + 1);
      bb_00 = (char *)&((bb_t)bb_00)->rpost;
    } while (pgVar85 < pgVar86);
    if (pgVar86 == (gen_ctx_t)0x0) {
LAB_0015dfa5:
      pVVar40 = (VARR_spill_el_t *)prVar38->lr_gap_bitmaps[0x23];
      if (pVVar40 == (VARR_spill_el_t *)0x0) {
        pVStack_148 = (bitmap_t)0x15e606;
        reg_alloc_cold_59();
LAB_0015e606:
        pVStack_148 = (bitmap_t)0x15e60b;
        reg_alloc_cold_54();
LAB_0015e60b:
        pVStack_148 = (bitmap_t)0x15e610;
        reg_alloc_cold_52();
LAB_0015e610:
        pVStack_148 = (bitmap_t)0x15e615;
        reg_alloc_cold_53();
LAB_0015e615:
        pVStack_148 = (bitmap_t)0x15e61a;
        reg_alloc_cold_55();
LAB_0015e61a:
        pVStack_148 = (bitmap_t)0x15e63c;
        __assert_fail("first_insn->code == MIR_LABEL",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x3b9,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
      }
    }
    else {
      if (pbVar81 == (bb_insn_t)0x0) {
LAB_0015e3e8:
        pVStack_148 = (bitmap_t)0x15e3ed;
        reg_alloc_cold_58();
LAB_0015e3ed:
        pVStack_148 = (bitmap_t)0x15e40c;
        __assert_fail("(DLIST_bb_insn_t_head (&(bb->bb_insns))) != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x2041,"void collect_spill_els(gen_ctx_t)");
      }
      __ptr_01 = *(ra_ctx **)&pbVar81->mem_index;
      bb_00 = (char *)0x0;
      prVar34 = __ptr_01;
      do {
        if (__ptr_01 == (ra_ctx *)0x0) goto LAB_0015e3e8;
        pMStack_108 = (MIR_context_t)
                      ((anon_union_8_2_0ec0d2a8_for_u *)&pbStack_100->pre)[(long)bb_00 * 2].e;
        pbVar81->insn = (MIR_insn_t)0x0;
        if ((bb_00 < pgVar86) &&
           (pMStack_108 ==
            (MIR_context_t)((anon_union_8_2_0ec0d2a8_for_u *)&pbStack_100->pre)[(long)bb_00 * 2].e))
        {
          pDVar54 = (DLIST_LINK_MIR_item_t *)(&pbStack_100->index + (long)bb_00 * 2);
          do {
            uVar71 = *(uint *)&pDVar54->prev;
            pMVar84 = (MIR_insn_t)((ulong)uVar71 + 0x40 >> 6);
            lVar88 = (long)pMVar84 - (long)pbVar81->insn;
            if (pbVar81->insn <= pMVar84 && lVar88 != 0) {
              do {
                pMVar53 = pbVar81->insn;
                pMVar84 = (MIR_insn_t)((long)&pMVar53->data + 1);
                if (*(MIR_insn_t *)&pbVar81->gvn_val_const_p < pMVar84) {
                  lVar74 = (long)pMVar84->ops + (((ulong)pMVar84 >> 1) - 0x20);
                  pVStack_148 = (bitmap_t)0x15d306;
                  prVar34 = (ra_ctx *)realloc(__ptr_01,lVar74 * 8);
                  *(ra_ctx **)&pbVar81->mem_index = prVar34;
                  *(long *)&pbVar81->gvn_val_const_p = lVar74;
                  pMVar53 = pbVar81->insn;
                  pMVar84 = (MIR_insn_t)((long)&pMVar53->data + 1);
                  __ptr_01 = prVar34;
                }
                lVar88 = lVar88 + -1;
                pbVar81->insn = pMVar84;
                __ptr_01->lr_gap_bitmaps[(long)(&pMVar53[-1].ops[0].u.reg + 6)] = (bitmap_t)0x0;
              } while (lVar88 != 0);
              prVar38 = pgStack_110->ra_ctx;
            }
            prVar34->lr_gap_bitmaps[(ulong)(uVar71 >> 6) - 8] =
                 (bitmap_t)
                 ((ulong)prVar34->lr_gap_bitmaps[(ulong)(uVar71 >> 6) - 8] |
                 1L << ((ulong)uVar71 & 0x3f));
            pgVar41 = (gen_ctx_t)prVar38->lr_gap_bitmaps[0x23];
            if (pgVar41 == (gen_ctx_t)0x0) goto LAB_0015e354;
            pgVar86 = (gen_ctx_t)pgVar41->ctx;
            ppgVar18 = (gen_ctx **)&((gen_ctx_t)bb_00)->ctx;
            bb_00 = (char *)((long)ppgVar18 + 1);
            __ptr_01 = prVar34;
          } while ((bb_00 < pgVar86) &&
                  (pDVar54 = (DLIST_LINK_MIR_item_t *)&pbStack_100->rpost + (long)ppgVar18,
                  pMStack_108 == (MIR_context_t)(&pbStack_100->bfs)[(long)ppgVar18 * 2]));
        }
        pMVar70 = pMStack_108;
        if (*(char *)((long)&pMStack_108->temp_string + 2) != '\0') {
          pVVar67 = pMStack_108->gen_ctx->addr_regs;
          for (pVVar13 = pVVar67; pVVar13 != (bitmap_t)0x0; pVVar13 = (bitmap_t)pVVar13[1].varr) {
            if (*(char *)((long)&pVVar13[2].els_num + 2) == '\0') goto LAB_0015d1ea;
          }
          pbVar32 = (bb_insn_t)pMStack_108->gen_ctx->call_used_hard_regs[3];
          if (pbVar32 == (bb_insn_t)0x0) goto LAB_0015e4a2;
          pMVar70 = (MIR_context_t)pbVar81->insn;
          pMStack_e0 = (MIR_context_t)pbVar32->insn;
          pMVar52 = pMVar70;
          __s1 = __ptr_01;
          if (pMStack_e0 < pMVar70) {
            puVar2 = &pbVar32->mem_index;
            pbVar32 = pbVar81;
            pMVar52 = pMStack_e0;
            __s1 = *(ra_ctx **)puVar2;
            pMStack_e0 = pMVar70;
          }
          pbStack_d0 = *(bb_insn_t *)&pbVar32->mem_index;
          pVStack_148 = (bitmap_t)0x15d1aa;
          pgStack_f8 = pgVar41;
          prStack_f0 = __ptr_01;
          prStack_e8 = prVar38;
          iVar62 = bcmp(__s1,pbStack_d0,(long)pMVar52 * 8);
          pMVar70 = pMStack_108;
          prVar38 = prStack_e8;
          pgVar41 = pgStack_f8;
          __ptr_01 = prStack_f0;
          if (iVar62 == 0) {
            if (pMVar52 < pMStack_e0) {
              do {
                if ((&pbStack_d0->insn)[(long)pMVar52] != (MIR_insn_t)0x0) goto LAB_0015d1ea;
                pMVar52 = (MIR_context_t)((long)&pMVar52->gen_ctx + 1);
              } while (pMStack_e0 != pMVar52);
            }
          }
          else {
LAB_0015d1ea:
            for (; pVVar67 != (bitmap_t)0x0; pVVar67 = (bitmap_t)pVVar67[1].varr) {
              *(undefined1 *)((long)&pVVar67[2].els_num + 2) = 0;
            }
          }
        }
        if (*(char *)((long)&pMVar70->temp_string + 3) != '\0') {
          pMVar84 = ((DLIST_LINK_MIR_insn_t *)&pMVar70->c2mir_ctx)->prev;
          pMVar31 = pMVar84->ops[0].u.ref;
          for (pMVar14 = pMVar31; pMVar14 != (MIR_item_t)0x0; pMVar14 = (pMVar14->item_link).next) {
            if (*(char *)((long)&pMVar14->addr + 3) == '\0') goto LAB_0015d2b1;
          }
          pbVar32 = *(bb_insn_t *)&pMVar84[1].ops[0].field_0x8;
          if (pbVar32 == (bb_insn_t)0x0) goto LAB_0015e4a7;
          pMVar70 = (MIR_context_t)pbVar81->insn;
          pMStack_108 = (MIR_context_t)pbVar32->insn;
          pbVar33 = pbVar81;
          pMVar52 = pMVar70;
          if (pMStack_108 < pMVar70) {
            pbVar33 = pbVar32;
            pbVar32 = pbVar81;
            pMVar52 = pMStack_108;
            pMStack_108 = pMVar70;
          }
          pMStack_e0 = *(MIR_context_t *)&pbVar32->mem_index;
          pVStack_148 = (bitmap_t)0x15d276;
          pgStack_f8 = pgVar41;
          prStack_f0 = __ptr_01;
          prStack_e8 = prVar38;
          iVar62 = bcmp(*(void **)&pbVar33->mem_index,pMStack_e0,(long)pMVar52 * 8);
          prVar38 = prStack_e8;
          pgVar41 = pgStack_f8;
          __ptr_01 = prStack_f0;
          if (iVar62 == 0) {
            if (pMVar52 < pMStack_108) {
              do {
                if ((&pMStack_e0->gen_ctx)[(long)pMVar52] != (gen_ctx *)0x0) goto LAB_0015d2b1;
                pMVar52 = (MIR_context_t)((long)&pMVar52->gen_ctx + 1);
              } while (pMStack_108 != pMVar52);
            }
          }
          else {
LAB_0015d2b1:
            for (; pMVar31 != (MIR_item_t)0x0; pMVar31 = (pMVar31->item_link).next) {
              *(undefined1 *)((long)&pMVar31->addr + 3) = 0;
            }
          }
        }
        auVar95 = in_ZMM2._0_16_;
        auVar96 = in_ZMM0._0_16_;
      } while (bb_00 < pgVar86);
      if (pgVar86 != (gen_ctx_t)0x0) {
        paVar35 = (anon_union_8_2_0ec0d2a8_for_u *)&pbStack_100->pre;
        do {
          peVar91 = paVar35->e;
          if ((peVar91->flag1 != '\0') && (peVar91->flag2 != '\0')) {
            if ((peVar91->src->out_edges).head == (peVar91->src->out_edges).tail) {
              peVar91->flag1 = '\0';
            }
            else if ((peVar91->dst->in_edges).head == (peVar91->dst->in_edges).tail) {
              peVar91->flag2 = '\0';
            }
          }
          paVar35 = paVar35 + 2;
          pgVar86 = (gen_ctx_t)((long)&pgVar86[-1].spot_attrs + 7);
        } while (pgVar86 != (gen_ctx_t)0x0);
      }
      if (pgVar41->ctx == (MIR_context_t)0x0) goto LAB_0015dfa5;
      pMStack_108 = (MIR_context_t)(ulong)pgStack_110->curr_bb_index;
      uVar63 = 0;
      pbVar50 = pbStack_100;
      do {
        if (*(char *)((long)&pbVar50->index + uVar63 * 0x10 + 5) == '\0') {
          pVStack_148 = (bitmap_t)0x15e49a;
          __assert_fail("spill_els_addr[n].edge_p",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x20c3,"void transform_edge_to_bb_placement(gen_ctx_t)");
        }
        ppvVar87 = (void **)(&pbVar50->index + uVar63 * 2);
        peVar91 = ((anon_union_8_2_0ec0d2a8_for_u *)(ppvVar87 + 1))->e;
        *(undefined2 *)((long)ppvVar87 + 5) = 0;
        if (peVar91->flag1 == '\0') {
          if (peVar91->flag2 == '\0') {
            pgVar86 = (gen_ctx_t)peVar91->src;
            if (pgVar86->ctx < pMStack_108) {
              pgVar85 = (gen_ctx_t)peVar91->dst;
              if (pgVar85->ctx < pMStack_108) {
                pbVar81 = (bb_insn_t)pgVar86->temp_bitmap2;
                pbVar47 = ((DLIST_bb_insn_t *)&pgVar85->temp_bitmap)->head;
                prStack_e8 = (ra_ctx *)pbVar81->insn;
                pMVar70 = pgStack_110->ctx;
                prVar38 = (ra_ctx *)pbVar47->insn;
                pgStack_f8 = pgVar85;
                if (((FILE *)pgStack_110->debug_file != (FILE *)0x0) &&
                   (3 < *(int *)&((DLIST_LINK_bb_t *)&pgStack_110->debug_level)->prev)) {
                  in_ZMM0 = ZEXT1664(in_ZMM0._0_16_);
                  in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
                  pVStack_148 = (bitmap_t)0x15d4d5;
                  prStack_f0 = prVar38;
                  pMStack_e0 = pMVar70;
                  pbStack_d0 = pbVar81;
                  fprintf((FILE *)pgStack_110->debug_file,"    Splitting bb%lu->bb%lu:\n");
                  prVar38 = prStack_f0;
                  pbVar81 = pbStack_d0;
                  pMVar70 = pMStack_e0;
                }
                pgVar41 = pgStack_f8;
                pgVar85 = pgStack_110;
                auVar96 = in_ZMM2._0_16_;
                if (((DLIST_out_edge_t *)&pgVar86->addr_regs)->head ==
                    (out_edge_t)pgVar86->insn_to_consider) {
                  if (peVar91->fall_through_p != '\0') goto LAB_0015d64a;
                  bb_00 = (char *)pgVar86;
                  if (((DLIST_in_edge_t *)&pgVar86->addr_insn_p)->head !=
                      (in_edge_t_conflict)pgVar86->tied_regs) {
                    if ((1 < *(int *)&prStack_e8->used_locs - 0xabU) &&
                       (*(int *)&prStack_e8->used_locs != 0x76)) goto LAB_0015e6bd;
                    in_ZMM2 = ZEXT1664(auVar96);
                    pVStack_148 = (bitmap_t)0x15d83a;
                    delete_bb_insn(pgStack_110,pbVar81);
                    goto LAB_0015d680;
                  }
                }
                else {
                  if (peVar91->fall_through_p == '\0') {
                    peVar42 = *(in_edge_t *)&pgStack_f8->addr_insn_p;
                    ppVVar1 = &pgStack_f8->tied_regs;
                    if (peVar42 == (in_edge_t)pgStack_f8->tied_regs) {
                      if (*(int *)&prVar38->used_locs != 0xb4) goto LAB_0015e665;
                      pbVar50 = pbStack_100;
                      bb_00 = (char *)pgStack_f8;
                      if (pbVar47 == (bb_insn_t_conflict)pgStack_f8->temp_bitmap2)
                      goto LAB_0015d7ca;
                      in_ZMM2 = ZEXT1664(auVar96);
                      pVStack_148 = (bitmap_t)0x15d877;
                      pDStack_c8 = (DLIST_LINK_in_edge_t *)ppVVar1;
                      delete_bb_insn(pgStack_110,pbVar47);
                      pVStack_148 = (bitmap_t)0x15d88a;
                      prStack_f0 = prVar38;
                      bb_00 = (char *)create_bb(pgVar85,(MIR_insn_t)prVar38);
                      pVStack_148 = (bitmap_t)0x15d8a3;
                      DLIST_bb_t_insert_before
                                (&pgVar85->curr_cfg->bbs,(bb_t_conflict)pgVar41,(bb_t_conflict)bb_00
                                );
                      pgVar68 = pgStack_110;
                      uVar71 = pgVar85->curr_bb_index;
                      pgVar85->curr_bb_index = uVar71 + 1;
                      ((gen_ctx_t)bb_00)->ctx = (MIR_context_t)(ulong)uVar71;
                      peVar42 = (peVar91->in_link).prev;
                      if (peVar42 == (in_edge_t)0x0) {
                        if (*(edge_t_conflict *)&pgVar41->addr_insn_p == peVar91) {
                          peVar57 = (peVar91->in_link).next;
                          *(in_edge_t *)&pgVar41->addr_insn_p = peVar57;
                          goto LAB_0015d9cb;
                        }
LAB_0015e6e4:
                        pVStack_148 = (bitmap_t)0x15e6e9;
                        reg_alloc_cold_48();
LAB_0015e6e9:
                        pVStack_148 = (bitmap_t)0x15e6ee;
                        reg_alloc_cold_49();
LAB_0015e6ee:
                        pVStack_148 = (bitmap_t)0x15e6f3;
                        reg_alloc_cold_51();
LAB_0015e6f3:
                        pVStack_148 = (bitmap_t)0x15e712;
                        __assert_fail("!MIR_any_branch_code_p (tail_insn->code)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x3c5,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                      }
                      peVar57 = (peVar91->in_link).next;
                      (peVar42->in_link).next = peVar57;
LAB_0015d9cb:
                      if (peVar57 == (in_edge_t)0x0) {
                        pDVar55 = pDStack_c8;
                        if (pDStack_c8->prev != peVar91) goto LAB_0015e6e9;
                      }
                      else {
                        pDVar55 = &peVar57->in_link;
                      }
                      in_ZMM0 = ZEXT864(0) << 0x40;
                      pDVar55->prev = peVar42;
                      (peVar91->in_link).prev = (in_edge_t)0x0;
                      (peVar91->in_link).next = (in_edge_t)0x0;
                      peVar91->dst = (bb_t)bb_00;
                      peVar42 = (in_edge_t)((gen_ctx_t)bb_00)->tied_regs;
                      if (peVar42 == (in_edge_t)0x0) {
                        if (*(VARR_char **)&((gen_ctx_t)bb_00)->addr_insn_p != (VARR_char *)0x0)
                        goto LAB_0015e6ee;
                        ppeVar58 = (in_edge_t *)&((gen_ctx_t)bb_00)->addr_insn_p;
                      }
                      else {
                        if ((peVar42->in_link).next != (in_edge_t)0x0) {
                          pVStack_148 = (bitmap_t)0x15e6bd;
                          reg_alloc_cold_50();
LAB_0015e6bd:
                          pVStack_148 = (bitmap_t)0x15e6df;
                          __assert_fail("last_insn->code == MIR_JMP || last_insn->code == MIR_RET || last_insn->code == MIR_JRET"
                                        ,
                                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                        ,0x392,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                        }
                        ppeVar58 = &(peVar42->in_link).next;
                      }
                      *ppeVar58 = peVar91;
                      (peVar91->in_link).next = (in_edge_t)0x0;
                      (peVar91->in_link).prev = peVar42;
                      ((gen_ctx_t)bb_00)->tied_regs = (bitmap_t)peVar91;
                      pVStack_148 = (bitmap_t)0x15da52;
                      create_edge(pgStack_110,(bb_t_conflict)bb_00,(bb_t_conflict)pgVar41,1,1);
                      pgVar85 = pgStack_f8;
                      pbVar50 = pbStack_100;
                      pgVar86 = pgVar41;
                      if (((FILE *)pgVar68->debug_file == (FILE *)0x0) || (pgVar68->debug_level < 4)
                         ) goto LAB_0015d7ca;
                      pVStack_148 = (bitmap_t)0x15da82;
                      fprintf((FILE *)pgVar68->debug_file,
                              "     creating bb%lu before bb%lu, redirect the edge to it",
                              (gen_ctx *)((gen_ctx_t)bb_00)->ctx,pgStack_f8->ctx);
                      pVStack_148 = (bitmap_t)0x15da9a;
                      fprintf((FILE *)pgVar68->debug_file,
                              ", and create fall-through edge bb%lu->bb%lu:\n",
                              (gen_ctx *)((gen_ctx_t)bb_00)->ctx,pgVar85->ctx);
                      pVStack_148 = (bitmap_t)0x15dab4;
                      fwrite("       new bb insn is ",0x16,1,(FILE *)pgVar68->debug_file);
                      prVar38 = prStack_f0;
                      goto LAB_0015d7b8;
                    }
                    pDStack_c8 = (DLIST_LINK_in_edge_t *)ppVVar1;
                    if (*(int *)&prVar38->used_locs != 0xb4) goto LAB_0015e61a;
                    for (; prStack_f0 = prVar38, pMStack_e0 = pMVar70, pbStack_d0 = pbVar81,
                        peVar42 != (in_edge_t)0x0; peVar42 = (peVar42->in_link).next) {
                      if (peVar42->fall_through_p != '\0') {
                        if ((gen_ctx_t)peVar42->dst != pgStack_f8) goto LAB_0015e696;
                        pVStack_148 = (bitmap_t)0x15d901;
                        MIR_new_label_op(pMVar70,(MIR_label_t)prVar38);
                        pVStack_120 = pVStack_90;
                        pVStack_118 = pVStack_88;
                        pMStack_140 = (MIR_context_t)rStack_b0.bb;
                        pbStack_138 = (bb_t)rStack_b0.live;
                        prStack_130 = (ra_ctx *)rStack_b0.regs_to_save;
                        pVStack_128 = pVStack_98;
                        pVStack_148 = (bitmap_t)0x15d930;
                        insn = MIR_new_insn(pMVar70,MIR_JMP);
                        pgVar85 = pgStack_110;
                        pMVar84 = ((peVar42->src->bb_insns).tail)->insn;
                        pMStack_b8 = insn;
                        if (((peVar42->out_link).next == (out_edge_t)0x0) &&
                           ((peVar42->out_link).prev == (out_edge_t)0x0)) {
                          iVar62 = (int)*(undefined8 *)&pMVar84->field_0x18;
                          if (((0xffffffd0 < iVar62 - 0xa5U) || (iVar62 == 0xaa)) ||
                             (iVar62 == 0xa6)) goto LAB_0015e6f3;
                          pVStack_148 = (bitmap_t)0x15df09;
                          gen_add_insn_after(pgStack_110,pMVar84,insn);
                          peVar42->fall_through_p = '\0';
                          if (((FILE *)pgVar85->debug_file == (FILE *)0x0) ||
                             (pgStack_110->debug_level < 4)) break;
                          sVar90 = peVar42->src->index;
                          pVStack_148 = (bitmap_t)0x15df52;
                          fprintf((FILE *)pgVar85->debug_file,
                                  "     Make edge bb%lu->bb%lu a non-fall through, add new insn at the of bb%lu "
                                  ,sVar90,peVar42->dst->index,sVar90);
                          pgVar86 = pgStack_110;
                        }
                        else {
                          pVStack_148 = (bitmap_t)0x15d96b;
                          MIR_insert_insn_after(pMVar70,pgStack_110->curr_func_item,pMVar84,insn);
                          pVStack_148 = (bitmap_t)0x15d976;
                          pbVar39 = create_bb(pgVar85,insn);
                          pgVar86 = (gen_ctx_t)peVar42->src;
                          pVStack_148 = (bitmap_t)0x15d987;
                          pgVar68 = pgVar85;
                          insert_new_bb_after(pgVar85,(bb_t_conflict)pgVar86,pbVar39);
                          pgVar41 = pgStack_110;
                          pbVar50 = peVar42->dst;
                          pgVar43 = (gen_ctx *)(peVar42->in_link).prev;
                          if (pgVar43 == (gen_ctx *)0x0) {
                            if ((pbVar50->in_edges).head == peVar42) {
                              pFVar76 = (FILE *)(peVar42->in_link).next;
                              (pbVar50->in_edges).head = (in_edge_t_conflict)pFVar76;
                              goto LAB_0015dad5;
                            }
                            pVStack_148 = (bitmap_t)0x15e717;
                            reg_alloc_cold_39();
LAB_0015e717:
                            pVStack_148 = (bitmap_t)0x15e71c;
                            reg_alloc_cold_40();
LAB_0015e71c:
                            pVStack_148 = (bitmap_t)add_bb_insn_dead_vars;
                            reg_alloc_cold_42();
                            pgStack_170 = pgVar85;
                            pbStack_168 = pbVar39;
                            ppvStack_160 = ppvVar87;
                            peStack_158 = peVar42;
                            peStack_150 = peVar91;
                            pVStack_148 = (bitmap_t)uVar63;
                            if (pgVar68->optimize_level == 0) goto LAB_0015ebdf;
                            pgVar41 = (gen_ctx_t)malloc(0x18);
                            pgVar85 = (gen_ctx_t)0x20;
                            pgVar41->ctx = (MIR_context_t)0x0;
                            *(c2mir_ctx **)&pgVar41->optimize_level = (c2mir_ctx *)0x4;
                            pMVar31 = (MIR_item_t)malloc(0x20);
                            pgVar41->curr_func_item = pMVar31;
                            pbVar39 = (pgVar68->curr_cfg->bbs).head;
                            if (pbVar39 == (bb_t_conflict)0x0) goto LAB_0015eb8c;
                            pgStack_190 = (gen_ctx_t)&pgVar68->free_dead_vars;
                            ppbStack_198 = (bb_t *)&(pgVar68->free_dead_vars).tail;
                            goto LAB_0015e79e;
                          }
                          pFVar76 = (FILE *)(peVar42->in_link).next;
                          pgVar43->debug_file = pFVar76;
LAB_0015dad5:
                          if (pFVar76 == (FILE *)0x0) {
                            pgVar86 = (gen_ctx_t)0x0;
                            if ((pbVar50->in_edges).tail != peVar42) goto LAB_0015e717;
                            pgVar86 = (gen_ctx_t)&(pbVar50->in_edges).tail;
                          }
                          else {
                            pgVar86 = (gen_ctx_t)&pFVar76->_IO_read_end;
                          }
                          pgVar86->ctx = (MIR_context_t)pgVar43;
                          (peVar42->in_link).prev = (in_edge_t)0x0;
                          (peVar42->in_link).next = (in_edge_t)0x0;
                          peVar42->dst = pbVar39;
                          peVar37 = (pbVar39->in_edges).tail;
                          if (peVar37 == (in_edge_t_conflict)0x0) {
                            if ((pbVar39->in_edges).head != (in_edge_t_conflict)0x0)
                            goto LAB_0015e71c;
                            pDVar56 = &pbVar39->in_edges;
                          }
                          else {
                            if ((peVar37->in_link).next != (in_edge_t)0x0) {
                              pVStack_148 = (bitmap_t)0x15e6e4;
                              reg_alloc_cold_41();
                              goto LAB_0015e6e4;
                            }
                            pDVar56 = (DLIST_in_edge_t *)&(peVar37->in_link).next;
                          }
                          pDVar56->head = peVar42;
                          (peVar42->in_link).next = (in_edge_t)0x0;
                          (peVar42->in_link).prev = peVar37;
                          (pbVar39->in_edges).tail = peVar42;
                          pVStack_148 = (bitmap_t)0x15db5e;
                          create_edge(pgStack_110,pbVar39,(bb_t_conflict)pgStack_f8,0,1);
                          pgVar85 = pgStack_f8;
                          if (((FILE *)pgVar41->debug_file == (FILE *)0x0) ||
                             (pgStack_110->debug_level < 4)) break;
                          pMStack_140 = (MIR_context_t)pbVar39->index;
                          sVar90 = peVar42->src->index;
                          pVStack_148 = (bitmap_t)0x15dba5;
                          fprintf((FILE *)pgVar41->debug_file,
                                  "     creating bb%lu after bb%lu, redirect edge bb%lu->bb%lu to bb%lu"
                                  ,pMStack_140,sVar90,sVar90);
                          pgVar86 = pgStack_110;
                          pVStack_148 = (bitmap_t)0x15dbc3;
                          fprintf((FILE *)pgStack_110->debug_file,
                                  ", and create jump edge bb%lu->bb%lu:\n",pbVar39->index,
                                  pgVar85->ctx);
                          pVStack_148 = (bitmap_t)0x15dbdd;
                          fwrite("       new bb insn is ",0x16,1,(FILE *)pgVar86->debug_file);
                        }
                        pVStack_148 = (bitmap_t)0x15dbf2;
                        print_bb_insn(pgVar86,(bb_insn_t_conflict)pMStack_b8->data,0);
                        break;
                      }
                      pbVar32 = (peVar42->src->bb_insns).tail;
                      if ((pbVar32 == (bb_insn_t)0x0) ||
                         (((iVar62 = (int)*(undefined8 *)&pbVar32->insn->field_0x18,
                           iVar62 - 0xa5U < 0xffffffd1 && (iVar62 != 0xa6)) && (iVar62 != 0xaa))))
                      goto LAB_0015e5df;
                    }
                    pMVar70 = pMStack_e0;
                    pgVar41 = pgStack_f8;
                    in_ZMM2 = ZEXT1664(auVar96);
                    pVStack_148 = (bitmap_t)0x15dc0d;
                    pgVar86 = (gen_ctx_t)MIR_new_label(pMStack_e0);
                    pgVar85 = pgStack_110;
                    pVStack_148 = (bitmap_t)0x15dc29;
                    MIR_insert_insn_before
                              (pMVar70,pgStack_110->curr_func_item,(MIR_insn_t_conflict)prStack_f0,
                               (MIR_insn_t_conflict)pgVar86);
                    pVStack_148 = (bitmap_t)0x15dc34;
                    bb_00 = (char *)create_bb(pgVar85,(MIR_insn_t)pgVar86);
                    pVStack_148 = (bitmap_t)0x15dc4d;
                    DLIST_bb_t_insert_before
                              (&pgVar85->curr_cfg->bbs,(bb_t_conflict)pgVar41,(bb_t_conflict)bb_00);
                    pgVar41 = pgStack_110;
                    uVar71 = pgVar85->curr_bb_index;
                    pgVar85->curr_bb_index = uVar71 + 1;
                    ((gen_ctx_t)bb_00)->ctx = (MIR_context_t)(ulong)uVar71;
                    if (peVar91 == (edge_t_conflict)0x0) {
                      pVStack_148 = (bitmap_t)0x15e641;
                      reg_alloc_cold_47();
                      goto LAB_0015e641;
                    }
                    peVar42 = (peVar91->in_link).prev;
                    if (peVar42 == (in_edge_t)0x0) {
                      if (*(edge_t_conflict *)&pgStack_f8->addr_insn_p == peVar91) {
                        peVar57 = (peVar91->in_link).next;
                        *(in_edge_t *)&pgStack_f8->addr_insn_p = peVar57;
                        goto LAB_0015dc9c;
                      }
                      pVStack_148 = (bitmap_t)0x15e68c;
                      reg_alloc_cold_43();
LAB_0015e68c:
                      pVStack_148 = (bitmap_t)0x15e691;
                      reg_alloc_cold_44();
LAB_0015e691:
                      pVStack_148 = (bitmap_t)0x15e696;
                      reg_alloc_cold_46();
LAB_0015e696:
                      pVStack_148 = (bitmap_t)0x15e6b8;
                      __assert_fail("e2->dst == dst",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x3c0,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                    }
                    peVar57 = (peVar91->in_link).next;
                    (peVar42->in_link).next = peVar57;
LAB_0015dc9c:
                    if (peVar57 == (in_edge_t)0x0) {
                      pDVar55 = pDStack_c8;
                      if (pDStack_c8->prev != peVar91) goto LAB_0015e68c;
                    }
                    else {
                      pDVar55 = &peVar57->in_link;
                    }
                    pDVar55->prev = peVar42;
                    (peVar91->in_link).prev = (in_edge_t)0x0;
                    (peVar91->in_link).next = (in_edge_t)0x0;
                    peVar91->dst = (bb_t)bb_00;
                    peVar42 = (in_edge_t)((gen_ctx_t)bb_00)->tied_regs;
                    if (peVar42 == (in_edge_t)0x0) {
                      if (*(VARR_char **)&((gen_ctx_t)bb_00)->addr_insn_p != (VARR_char *)0x0)
                      goto LAB_0015e691;
                      ppeVar58 = (in_edge_t *)&((gen_ctx_t)bb_00)->addr_insn_p;
                    }
                    else {
                      if ((peVar42->in_link).next != (in_edge_t)0x0) {
                        pVStack_148 = (bitmap_t)0x15e665;
                        reg_alloc_cold_45();
LAB_0015e665:
                        pVStack_148 = (bitmap_t)0x15e687;
                        __assert_fail("first_insn->code == MIR_LABEL",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x3a6,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                      }
                      ppeVar58 = &(peVar42->in_link).next;
                    }
                    *ppeVar58 = peVar91;
                    (peVar91->in_link).next = (in_edge_t)0x0;
                    (peVar91->in_link).prev = peVar42;
                    ((gen_ctx_t)bb_00)->tied_regs = (bitmap_t)peVar91;
                    pVStack_148 = (bitmap_t)0x15dd20;
                    create_edge(pgStack_110,(bb_t_conflict)bb_00,(bb_t_conflict)pgStack_f8,1,1);
                    pgVar85 = pgStack_f8;
                    if (((FILE *)pgVar41->debug_file != (FILE *)0x0) && (3 < pgVar41->debug_level))
                    {
                      pVStack_148 = (bitmap_t)0x15dd50;
                      fprintf((FILE *)pgVar41->debug_file,
                              "     creating bb%lu before bb%lu, redirect the edge to it",
                              (gen_ctx *)((gen_ctx_t)bb_00)->ctx,pgStack_f8->ctx);
                      pVStack_148 = (bitmap_t)0x15dd68;
                      fprintf((FILE *)pgVar41->debug_file,
                              ", and create fall-through edge bb%lu->bb%lu:\n",
                              (gen_ctx *)((gen_ctx_t)bb_00)->ctx,pgVar85->ctx);
                      pVStack_148 = (bitmap_t)0x15dd82;
                      fwrite("       new bb insn is ",0x16,1,(FILE *)pgVar41->debug_file);
                      pVStack_148 = (bitmap_t)0x15dd90;
                      print_bb_insn(pgVar41,(bb_insn_t_conflict)pgVar86->ctx,0);
                      pVStack_148 = (bitmap_t)0x15ddaa;
                      fwrite("       change src bb insn ",0x1a,1,(FILE *)pgVar41->debug_file);
                      pVStack_148 = (bitmap_t)0x15ddb9;
                      print_bb_insn(pgVar41,pbStack_d0,0);
                    }
                    prVar38 = prStack_e8;
                    pVVar15 = prStack_e8->used_locs;
                    if ((int)pVVar15 == 0xaa) {
                      if ((ulong)pVVar15 >> 0x21 == 0) goto LAB_0015e5b6;
                      lVar88 = 0;
                      while (*(ra_ctx **)((long)prStack_e8->lr_gap_bitmaps + lVar88 + 0x20) !=
                             prStack_f0) {
                        lVar88 = lVar88 + 0x30;
                        if (((ulong)pVVar15 >> 0x20) * 0x30 + -0x30 == lVar88) goto LAB_0015e5b6;
                      }
                      pVStack_148 = (bitmap_t)0x15de6c;
                      MIR_new_label_op(pMStack_e0,(MIR_label_t)pgVar86);
                      auVar4._16_8_ = sStack_70;
                      auVar4._0_16_ = auStack_80;
                      auVar4._24_8_ = pVStack_68;
                      psVar3 = (size_t *)((long)prVar38->lr_gap_bitmaps + lVar88 + 0x20);
                      *psVar3 = sStack_70;
                      psVar3[1] = (size_t)pVStack_68;
                      psVar3[2] = (size_t)pVStack_60;
                      psVar3[3] = (size_t)pVStack_58;
                      *(undefined1 (*) [32])((long)prVar38->lr_gap_bitmaps + lVar88 + 0x10) = auVar4
                      ;
                    }
                    else {
                      if ((*(char *)&prStack_e8->var_bbs != '\f') ||
                         ((ra_ctx *)
                          (((anon_union_32_12_57d33f68_for_u *)&prStack_e8->spill_gaps)->str).len !=
                          prStack_f0)) {
LAB_0015e641:
                        pVStack_148 = (bitmap_t)0x15e660;
                        __assert_fail("last_insn->ops[0].mode == MIR_OP_LABEL && last_insn->ops[0].u.label == first_insn"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x3fa,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                      }
                      pMVar60 = (MIR_op_t *)&prStack_e8->busy_used_locs;
                      pVStack_148 = (bitmap_t)0x15de3c;
                      MIR_new_label_op(pMStack_e0,(MIR_label_t)pgVar86);
                      auVar4._16_8_ = sStack_70;
                      auVar4._0_16_ = auStack_80;
                      auVar4._24_8_ = pVStack_68;
                      (((anon_union_32_12_57d33f68_for_u *)&prVar38->spill_gaps)->str).len =
                           sStack_70;
                      prVar38->curr_gaps = pVStack_68;
                      prVar38->lr_gap_bitmaps[0] = pVStack_60;
                      prVar38->lr_gap_bitmaps[1] = pVStack_58;
                      *(undefined1 (*) [32])pMVar60 = auVar4;
                    }
                    pgVar68 = pgStack_110;
                    in_ZMM0 = ZEXT3264(auVar4);
                    pbVar50 = pbStack_100;
                    if (((FILE *)pgStack_110->debug_file == (FILE *)0x0) ||
                       (*(int *)&((DLIST_LINK_bb_t *)&pgStack_110->debug_level)->prev < 4))
                    goto LAB_0015d7ca;
                    in_ZMM0 = ZEXT1664(auVar4._0_16_);
                    in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
                    pVStack_148 = (bitmap_t)0x15dec1;
                    fwrite("         to insn ",0x11,1,(FILE *)pgStack_110->debug_file);
                    pbVar47 = pbStack_d0;
                  }
                  else {
LAB_0015d64a:
                    in_ZMM2 = ZEXT1664(auVar96);
                    pVStack_148 = (bitmap_t)0x15d661;
                    prVar38 = (ra_ctx *)MIR_new_insn_arr(pMVar70,MIR_USE,0,(MIR_op_t *)0x0);
                    pgVar85 = pgStack_110;
                    pVStack_148 = (bitmap_t)0x15d67d;
                    MIR_insert_insn_after
                              (pMVar70,pgStack_110->curr_func_item,(MIR_insn_t_conflict)prStack_e8,
                               (MIR_insn_t_conflict)prVar38);
                    prStack_e8 = prVar38;
LAB_0015d680:
                    pVStack_148 = (bitmap_t)0x15d68d;
                    bb_00 = (char *)create_bb(pgVar85,(MIR_insn_t)prStack_e8);
                    pVStack_148 = (bitmap_t)0x15d69e;
                    insert_new_bb_after(pgVar85,(bb_t_conflict)pgVar86,(bb_t_conflict)bb_00);
                    pgVar68 = pgStack_110;
                    peVar42 = (peVar91->in_link).prev;
                    if (peVar42 == (in_edge_t)0x0) {
                      if (*(edge_t_conflict *)&pgStack_f8->addr_insn_p != peVar91)
                      goto LAB_0015e60b;
                      peVar57 = (peVar91->in_link).next;
                      *(in_edge_t *)&pgStack_f8->addr_insn_p = peVar57;
                    }
                    else {
                      peVar57 = (peVar91->in_link).next;
                      (peVar42->in_link).next = peVar57;
                    }
                    if (peVar57 == (in_edge_t)0x0) {
                      if ((edge_t_conflict)pgStack_f8->tied_regs != peVar91) goto LAB_0015e610;
                      pDVar55 = (DLIST_LINK_in_edge_t *)&pgStack_f8->tied_regs;
                    }
                    else {
                      pDVar55 = &peVar57->in_link;
                    }
                    in_ZMM0 = ZEXT864(0) << 0x40;
                    pDVar55->prev = peVar42;
                    (peVar91->in_link).prev = (in_edge_t)0x0;
                    (peVar91->in_link).next = (in_edge_t)0x0;
                    peVar91->dst = (bb_t)bb_00;
                    peVar42 = (in_edge_t)((gen_ctx_t)bb_00)->tied_regs;
                    if (peVar42 == (in_edge_t)0x0) {
                      if (*(VARR_char **)&((gen_ctx_t)bb_00)->addr_insn_p != (VARR_char *)0x0)
                      goto LAB_0015e615;
                      ppeVar58 = (in_edge_t *)&((gen_ctx_t)bb_00)->addr_insn_p;
                    }
                    else {
                      if ((peVar42->in_link).next != (in_edge_t)0x0) goto LAB_0015e606;
                      ppeVar58 = &(peVar42->in_link).next;
                    }
                    *ppeVar58 = peVar91;
                    (peVar91->in_link).next = (in_edge_t)0x0;
                    (peVar91->in_link).prev = peVar42;
                    ((gen_ctx_t)bb_00)->tied_regs = (bitmap_t)peVar91;
                    pVStack_148 = (bitmap_t)0x15d753;
                    create_edge(pgStack_110,(bb_t_conflict)bb_00,(bb_t_conflict)pgStack_f8,
                                (uint)peVar91->fall_through_p,1);
                    peVar91->fall_through_p = '\x01';
                    pbVar50 = pbStack_100;
                    if (((FILE *)pgVar68->debug_file == (FILE *)0x0) || (pgVar68->debug_level < 4))
                    goto LAB_0015d7ca;
                    pVStack_148 = (bitmap_t)0x15d77c;
                    fprintf((FILE *)pgVar68->debug_file,
                            "     creating fall through bb%lu after bb%lu, redirect the edge to it",
                            (gen_ctx *)((gen_ctx_t)bb_00)->ctx,pgVar86->ctx);
                    pVStack_148 = (bitmap_t)0x15d799;
                    fprintf((FILE *)pgVar68->debug_file,", and create edge bb%lu->bb%lu:\n",
                            (gen_ctx *)((gen_ctx_t)bb_00)->ctx,pgStack_f8->ctx);
                    pVStack_148 = (bitmap_t)0x15d7b3;
                    fwrite("       new bb insn is ",0x16,1,(FILE *)pgVar68->debug_file);
                    prVar38 = prStack_e8;
LAB_0015d7b8:
                    pbVar47 = *(bb_insn_t_conflict *)&prVar38->start_mem_loc;
                  }
                  pVStack_148 = (bitmap_t)0x15d7c5;
                  print_bb_insn(pgVar68,pbVar47,0);
                  pbVar50 = pbStack_100;
                }
LAB_0015d7ca:
                ((anon_union_8_2_0ec0d2a8_for_u *)(ppvVar87 + 1))->bb = (bb_t_conflict)bb_00;
              }
              else {
                peVar36 = ((DLIST_out_edge_t *)&pgVar85->addr_regs)->head;
                if (peVar36 == (out_edge_t)0x0) goto LAB_0015e561;
                lVar88 = 1;
                do {
                  peVar36 = (peVar36->out_link).next;
                  lVar88 = lVar88 + -1;
                } while (peVar36 != (out_edge_t)0x0);
                if ((lVar88 != 0) ||
                   (peVar37 = ((DLIST_in_edge_t *)&pgVar85->addr_insn_p)->head,
                   peVar37 == (in_edge_t_conflict)0x0)) goto LAB_0015e561;
                lVar88 = 1;
                do {
                  peVar37 = (peVar37->in_link).next;
                  lVar88 = lVar88 + -1;
                } while (peVar37 != (in_edge_t)0x0);
                if (lVar88 != 0) goto LAB_0015e561;
                ((anon_union_8_2_0ec0d2a8_for_u *)(ppvVar87 + 1))->bb = (bb_t_conflict)pgVar85;
              }
            }
            else {
              peVar36 = ((DLIST_out_edge_t *)&pgVar86->addr_regs)->head;
              if (peVar36 == (out_edge_t)0x0) goto LAB_0015e4e4;
              lVar88 = 1;
              do {
                peVar36 = (peVar36->out_link).next;
                lVar88 = lVar88 + -1;
              } while (peVar36 != (out_edge_t)0x0);
              if ((lVar88 != 0) ||
                 (peVar37 = ((DLIST_in_edge_t *)&pgVar86->addr_insn_p)->head,
                 peVar37 == (in_edge_t_conflict)0x0)) goto LAB_0015e4e4;
              lVar88 = 1;
              do {
                peVar37 = (peVar37->in_link).next;
                lVar88 = lVar88 + -1;
              } while (peVar37 != (in_edge_t)0x0);
              if (lVar88 != 0) goto LAB_0015e4e4;
              ((anon_union_8_2_0ec0d2a8_for_u *)(ppvVar87 + 1))->bb = (bb_t_conflict)pgVar86;
            }
          }
          else {
            *(bb_t *)(ppvVar87 + 1) = peVar91->dst;
          }
        }
        else {
          *(bb_t *)(ppvVar87 + 1) = peVar91->src;
          *(char *)((long)ppvVar87 + 6) = '\x01';
        }
        auVar95 = in_ZMM2._0_16_;
        auVar96 = in_ZMM0._0_16_;
        pVVar40 = pgStack_110->ra_ctx->spill_els;
        if (pVVar40 == (VARR_spill_el_t *)0x0) {
          pVStack_148 = (bitmap_t)0x15e4a2;
          reg_alloc_cold_56();
LAB_0015e4a2:
          pVStack_148 = (bitmap_t)0x15e4a7;
          reg_alloc_cold_37();
LAB_0015e4a7:
          pVStack_148 = (bitmap_t)0x15e4ac;
          reg_alloc_cold_38();
LAB_0015e4ac:
          pVStack_148 = (bitmap_t)0x15e4b1;
          reg_alloc_cold_15();
          goto LAB_0015e4b1;
        }
        uVar63 = uVar63 + 1;
      } while (uVar63 < pVVar40->els_num);
    }
    sVar90 = pVVar40->els_num;
  }
  pgVar41 = pgStack_110;
  in_ZMM0 = ZEXT1664(auVar96);
  in_ZMM2 = ZEXT1664(auVar95);
  pVStack_148 = (bitmap_t)0x15dfd4;
  qsort(psStack_c0,sVar90,0x10,spill_el_sort_cmp);
  pVVar40 = pgVar41->ra_ctx->spill_els;
  if (pVVar40 != (VARR_spill_el_t *)0x0) {
    pgVar85 = (gen_ctx_t)pVVar40->els_num;
    psVar30 = pVVar40->varr;
    if (pgVar85 != (gen_ctx_t)0x0) {
      if (pgVar85 != (gen_ctx_t)&DAT_00000001) {
        puVar69 = (undefined1 *)((long)&pgVar85[-1].spot_attrs + 7);
        bb_00 = (char *)(psVar30 + 1);
        lVar88 = 0;
        do {
          pVStack_148 = (bitmap_t)0x15e019;
          iVar62 = spill_el_cmp(psVar30 + lVar88,(spill_el_t *)bb_00);
          if (iVar62 != 0) {
            in_ZMM0 = ZEXT1664((undefined1  [16])*(spill_el_t *)bb_00);
            lVar88 = lVar88 + 1;
            psVar30[lVar88] = *(spill_el_t *)bb_00;
          }
          bb_00 = (char *)((long)bb_00 + 0x10);
          puVar69 = puVar69 + -1;
        } while (puVar69 != (undefined1 *)0x0);
        pVVar40 = pgVar41->ra_ctx->spill_els;
        if (pVVar40 == (VARR_spill_el_t *)0x0) goto LAB_0015e548;
        psVar30 = pVVar40->varr;
        pgVar85 = (gen_ctx_t)(lVar88 + 1);
        pgVar86 = pgVar85;
      }
      if ((psVar30 == (spill_el_t *)0x0) || ((gen_ctx_t)pVVar40->els_num < pgVar85))
      goto LAB_0015e548;
      pVVar40->els_num = (size_t)pgVar85;
    }
    pgVar85 = pgVar41;
    if (((FILE *)pgVar41->debug_file != (FILE *)0x0) && (1 < pgVar41->debug_level)) {
      pVStack_148 = (bitmap_t)0x15e09f;
      fwrite("+++++++++++++MIR after splitting edges:\n",0x28,1,(FILE *)pgVar41->debug_file);
      pVStack_148 = (bitmap_t)0x15e0b9;
      print_CFG(pgVar41,1,0,1,0,(_func_void_gen_ctx_t_bb_t *)0x0);
      pVStack_148 = (bitmap_t)0x15e0d3;
      fwrite("  Spills on BBs:\n",0x11,1,(FILE *)pgVar41->debug_file);
      pVVar40 = pgVar41->ra_ctx->spill_els;
      if (pVVar40 != (VARR_spill_el_t *)0x0) {
        uVar63 = 0xffffffffffffffff;
        pgVar86 = (gen_ctx_t)0x1c199e;
        bb_00 = "    %s r%d on %s of bb%lu\n";
        paVar35 = &psVar30->u;
        do {
          pgVar41 = pgStack_110;
          uVar63 = uVar63 + 1;
          if (pVVar40->els_num <= uVar63) goto LAB_0015e178;
          if (*(char *)((long)paVar35 + -3) != '\0') {
            pVStack_148 = (bitmap_t)0x15e44f;
            __assert_fail("!spill_els_addr[i].edge_p",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x2103,"void split(gen_ctx_t)");
          }
          pcVar59 = "spill";
          pcVar78 = "end";
          if (*(char *)((long)paVar35 + -4) == '\0') {
            pcVar59 = "restore";
          }
          if (*(char *)((long)paVar35 + -2) == '\0') {
            pcVar78 = "start";
          }
          pVStack_148 = (bitmap_t)0x15e15d;
          fprintf((FILE *)pgStack_110->debug_file,"    %s r%d on %s of bb%lu\n",pcVar59,
                  (ulong)((spill_el_t *)(paVar35 + -1))->reg,pcVar78,paVar35->e->src);
          pVVar40 = pgVar41->ra_ctx->spill_els;
          paVar35 = paVar35 + 2;
          pgVar85 = pgVar41;
        } while (pVVar40 != (VARR_spill_el_t *)0x0);
      }
      pVStack_148 = (bitmap_t)0x15e178;
      reg_alloc_cold_63();
      pVVar40 = extraout_RAX_00;
      pgVar85 = pgVar41;
    }
LAB_0015e178:
    pgVar41 = (gen_ctx_t)&psVar30->u;
    pMVar70 = (MIR_context_t)0xffffffffffffffff;
    do {
      pMVar70 = (MIR_context_t)((long)&pMVar70->gen_ctx + 1);
      if ((MIR_context_t)pVVar40->els_num <= pMVar70) goto LAB_0015c85c;
      psVar30 = (spill_el_t *)((long)pgVar41 + -8);
      if (psVar30->reg < 0x22) goto LAB_0015e35e;
      pcVar59 = (char *)((long)pgVar41 + -4);
      if (*(char *)((long)pgVar41 + -2) == '\0') {
        __stream = (FILE *)(((*(bb_t_conflict *)pgVar41)->bb_insns).head)->insn;
        bVar93 = *(int *)&__stream->_IO_read_base == 0xb4;
      }
      else {
        __stream = (FILE *)(((*(bb_t_conflict *)pgVar41)->bb_insns).tail)->insn;
        bVar93 = (*(int *)&__stream->_IO_read_base - 0xa6U & 0xfffffffb) != 0 &&
                 *(int *)&__stream->_IO_read_base - 0xa5U < 0xffffffd1;
      }
      pgVar41 = (gen_ctx_t)((long)pgVar41 + 0x10);
      pVStack_148 = (bitmap_t)0x15e204;
      spill_restore_reg(pgVar85,psVar30->reg,MStack_d4,(MIR_insn_t)__stream,(uint)bVar93,
                        (uint)(*pcVar59 == '\0'));
      pVVar40 = pgVar85->ra_ctx->spill_els;
    } while (pVVar40 != (VARR_spill_el_t *)0x0);
    pVStack_148 = (bitmap_t)0x15e220;
    reg_alloc_cold_64();
LAB_0015e226:
    pVStack_148 = (bitmap_t)0x15e23d;
    fprintf(__stream,"Compressing live ranges: from %ld to %ld - %ld%%\n",pgVar86,pgVar41);
    __stream = (FILE *)pgVar85->debug_file;
LAB_0015e241:
    pgVar85->lr_ctx->curr_point = (int)bb_00;
    if ((__stream != (FILE *)0x0) && (1 < pgVar85->debug_level)) {
      pVStack_148 = (bitmap_t)0x15e276;
      fwrite("Ranges after the compression:\n",0x1e,1,__stream);
      pVStack_148 = (bitmap_t)0x15e27e;
      print_all_live_ranges(pgVar85);
    }
    goto LAB_0015c35b;
  }
LAB_0015e588:
  pVStack_148 = (bitmap_t)0x15e58d;
  reg_alloc_cold_66();
LAB_0015e58d:
  pVStack_148 = (bitmap_t)0x15e5ac;
  __assert_fail("born_p || dead_p",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x18e9,"void shrink_live_ranges(gen_ctx_t)");
}

Assistant:

static void output_bb_border_live_info (gen_ctx_t gen_ctx, bb_t bb) {
  MIR_reg_t *map = scan_vars_num == 0 ? NULL : VARR_ADDR (MIR_reg_t, scan_var_to_var_map);
  output_bitmap (gen_ctx, "  live_in:", bb->live_in, TRUE, map);
  output_bitmap (gen_ctx, "  live_out:", bb->live_out, TRUE, map);
}